

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O2

bool embree::avx512::ConeCurveMiIntersectorK<8,_8,_true>::occluded
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *line)

{
  int iVar1;
  float fVar9;
  float fVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  Scene *pSVar21;
  Geometry *pGVar22;
  long lVar23;
  RTCFilterFunctionN p_Var24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  bool bVar52;
  bool bVar53;
  bool bVar54;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  bool bVar58;
  bool bVar59;
  bool bVar60;
  bool bVar61;
  bool bVar62;
  bool bVar63;
  bool bVar64;
  bool bVar65;
  bool bVar66;
  bool bVar67;
  bool bVar68;
  bool bVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  undefined8 uVar82;
  undefined8 uVar83;
  undefined8 uVar84;
  undefined8 uVar85;
  ulong uVar86;
  ulong uVar87;
  byte bVar88;
  byte bVar89;
  byte bVar90;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  bool bVar95;
  ulong uVar96;
  byte bVar97;
  byte bVar98;
  ulong uVar99;
  ulong uVar100;
  undefined1 auVar101 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar102 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [64];
  undefined1 auVar152 [32];
  undefined1 auVar153 [64];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 auVar158 [32];
  undefined1 auVar159 [64];
  undefined1 auVar160 [32];
  undefined1 auVar161 [64];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [64];
  undefined1 auVar168 [64];
  undefined1 auVar169 [64];
  undefined1 auVar170 [64];
  undefined1 auVar171 [64];
  undefined1 auVar172 [64];
  undefined1 auVar173 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  undefined1 auVar176 [64];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar182 [64];
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<8> hit;
  RTCFilterFunctionNArguments local_650;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  RTCHitN local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  uint local_100;
  uint uStack_fc;
  uint uStack_f8;
  uint uStack_f4;
  uint uStack_f0;
  uint uStack_ec;
  uint uStack_e8;
  uint uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar165 [64];
  
  pSVar21 = context->scene;
  pGVar22 = (pSVar21->geometries).items[line->sharedGeomID].ptr;
  uVar13 = (line->v0).field_0.i[0];
  lVar23 = *(long *)&pGVar22[1].time_range.upper;
  p_Var24 = pGVar22[1].intersectionFilterN;
  uVar14 = (line->v0).field_0.i[1];
  uVar15 = (line->v0).field_0.i[2];
  uVar16 = (line->v0).field_0.i[3];
  uVar17 = (line->v0).field_0.i[4];
  auVar112._16_16_ = *(undefined1 (*) [16])(lVar23 + (ulong)uVar17 * (long)p_Var24);
  auVar112._0_16_ = *(undefined1 (*) [16])(lVar23 + (ulong)uVar13 * (long)p_Var24);
  uVar18 = (line->v0).field_0.i[5];
  auVar135._16_16_ = *(undefined1 (*) [16])(lVar23 + (ulong)uVar18 * (long)p_Var24);
  auVar135._0_16_ = *(undefined1 (*) [16])(lVar23 + (ulong)uVar14 * (long)p_Var24);
  uVar19 = (line->v0).field_0.i[6];
  auVar117._16_16_ = *(undefined1 (*) [16])(lVar23 + (ulong)uVar19 * (long)p_Var24);
  auVar117._0_16_ = *(undefined1 (*) [16])(lVar23 + (ulong)uVar15 * (long)p_Var24);
  uVar20 = (line->v0).field_0.i[7];
  auVar113._16_16_ = *(undefined1 (*) [16])(lVar23 + (ulong)uVar20 * (long)p_Var24);
  auVar113._0_16_ = *(undefined1 (*) [16])(lVar23 + (ulong)uVar16 * (long)p_Var24);
  auVar101 = *(undefined1 (*) [16])(lVar23 + (ulong)(uVar17 + 1) * (long)p_Var24);
  auVar123._0_16_ =
       ZEXT116(0) * auVar101 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar23 + (ulong)(uVar13 + 1) * (long)p_Var24);
  auVar123._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar101;
  auVar101 = *(undefined1 (*) [16])(lVar23 + (ulong)(uVar18 + 1) * (long)p_Var24);
  auVar128._0_16_ =
       ZEXT116(0) * auVar101 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar23 + (ulong)(uVar14 + 1) * (long)p_Var24);
  auVar128._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar101;
  auVar101 = *(undefined1 (*) [16])(lVar23 + (ulong)(uVar19 + 1) * (long)p_Var24);
  auVar124._0_16_ =
       ZEXT116(0) * auVar101 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar23 + (ulong)(uVar15 + 1) * (long)p_Var24);
  auVar124._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar101;
  auVar101 = *(undefined1 (*) [16])(lVar23 + (ulong)(uVar20 + 1) * (long)p_Var24);
  auVar103._0_16_ =
       ZEXT116(0) * auVar101 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar23 + (ulong)(uVar16 + 1) * (long)p_Var24);
  auVar103._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar101;
  local_220 = vpbroadcastd_avx512vl();
  auVar109 = vunpcklps_avx(auVar112,auVar117);
  auVar107 = vunpckhps_avx(auVar112,auVar117);
  auVar112 = vunpcklps_avx(auVar135,auVar113);
  auVar108 = vunpckhps_avx(auVar135,auVar113);
  auVar117 = vunpcklps_avx(auVar109,auVar112);
  auVar112 = vunpckhps_avx(auVar109,auVar112);
  auVar113 = vunpcklps_avx(auVar107,auVar108);
  auVar135 = vunpckhps_avx(auVar107,auVar108);
  auVar109 = vpunpckldq_avx2(auVar123,auVar124);
  auVar107 = vpunpckhdq_avx2(auVar123,auVar124);
  auVar123 = vpunpckldq_avx2(auVar128,auVar103);
  auVar108 = vpunpckhdq_avx2(auVar128,auVar103);
  auVar128 = vpunpckldq_avx2(auVar109,auVar123);
  auVar123 = vpunpckhdq_avx2(auVar109,auVar123);
  auVar124 = vpunpckldq_avx2(auVar107,auVar108);
  auVar103 = vpunpckhdq_avx512vl(auVar107,auVar108);
  auVar107 = vpcmpeqd_avx2(auVar109,auVar109);
  uVar87 = vpcmpd_avx512vl(auVar107,(undefined1  [32])(line->primIDs).field_0,4);
  fVar9 = *(float *)(ray + k * 4);
  auVar111._4_4_ = fVar9;
  auVar111._0_4_ = fVar9;
  auVar111._8_4_ = fVar9;
  auVar111._12_4_ = fVar9;
  auVar111._16_4_ = fVar9;
  auVar111._20_4_ = fVar9;
  auVar111._24_4_ = fVar9;
  auVar111._28_4_ = fVar9;
  fVar10 = *(float *)(ray + k * 4 + 0x20);
  auVar114._4_4_ = fVar10;
  auVar114._0_4_ = fVar10;
  auVar114._8_4_ = fVar10;
  auVar114._12_4_ = fVar10;
  auVar114._16_4_ = fVar10;
  auVar114._20_4_ = fVar10;
  auVar114._24_4_ = fVar10;
  auVar114._28_4_ = fVar10;
  uVar11 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar115._4_4_ = uVar11;
  auVar115._0_4_ = uVar11;
  auVar115._8_4_ = uVar11;
  auVar115._12_4_ = uVar11;
  auVar115._16_4_ = uVar11;
  auVar115._20_4_ = uVar11;
  auVar115._24_4_ = uVar11;
  auVar115._28_4_ = uVar11;
  auVar104 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
  auVar175 = ZEXT3264(auVar104);
  auVar105 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
  auVar176 = ZEXT3264(auVar105);
  auVar106 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar177 = ZEXT3264(auVar106);
  auVar101 = vmulss_avx512f(auVar106._0_16_,auVar106._0_16_);
  auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar101),auVar105,auVar105);
  auVar107 = vfmadd231ps_avx512vl(auVar107,auVar104,auVar104);
  auVar109._0_4_ = auVar107._0_4_;
  auVar109._4_4_ = auVar109._0_4_;
  auVar109._8_4_ = auVar109._0_4_;
  auVar109._12_4_ = auVar109._0_4_;
  auVar109._16_4_ = auVar109._0_4_;
  auVar109._20_4_ = auVar109._0_4_;
  auVar109._24_4_ = auVar109._0_4_;
  auVar109._28_4_ = auVar109._0_4_;
  auVar108 = vrcp14ps_avx512vl(auVar109);
  auVar102 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
  auVar107._8_4_ = 0x3f800000;
  auVar107._0_8_ = 0x3f8000003f800000;
  auVar107._12_4_ = 0x3f800000;
  auVar107._16_4_ = 0x3f800000;
  auVar107._20_4_ = 0x3f800000;
  auVar107._24_4_ = 0x3f800000;
  auVar107._28_4_ = 0x3f800000;
  auVar107 = vfnmadd213ps_avx512vl(auVar109,auVar108,auVar107);
  auVar101 = vfmadd132ps_fma(auVar107,auVar108,auVar108);
  auVar110._0_4_ = auVar117._0_4_ + auVar128._0_4_;
  auVar110._4_4_ = auVar117._4_4_ + auVar128._4_4_;
  auVar110._8_4_ = auVar117._8_4_ + auVar128._8_4_;
  auVar110._12_4_ = auVar117._12_4_ + auVar128._12_4_;
  auVar110._16_4_ = auVar117._16_4_ + auVar128._16_4_;
  auVar110._20_4_ = auVar117._20_4_ + auVar128._20_4_;
  auVar110._24_4_ = auVar117._24_4_ + auVar128._24_4_;
  auVar110._28_4_ = auVar117._28_4_ + auVar128._28_4_;
  auVar116._0_4_ = auVar123._0_4_ + auVar112._0_4_;
  auVar116._4_4_ = auVar123._4_4_ + auVar112._4_4_;
  auVar116._8_4_ = auVar123._8_4_ + auVar112._8_4_;
  auVar116._12_4_ = auVar123._12_4_ + auVar112._12_4_;
  auVar116._16_4_ = auVar123._16_4_ + auVar112._16_4_;
  auVar116._20_4_ = auVar123._20_4_ + auVar112._20_4_;
  auVar116._24_4_ = auVar123._24_4_ + auVar112._24_4_;
  auVar116._28_4_ = auVar123._28_4_ + auVar112._28_4_;
  auVar118._0_4_ = auVar113._0_4_ + auVar124._0_4_;
  auVar118._4_4_ = auVar113._4_4_ + auVar124._4_4_;
  auVar118._8_4_ = auVar113._8_4_ + auVar124._8_4_;
  auVar118._12_4_ = auVar113._12_4_ + auVar124._12_4_;
  auVar118._16_4_ = auVar113._16_4_ + auVar124._16_4_;
  auVar118._20_4_ = auVar113._20_4_ + auVar124._20_4_;
  auVar118._24_4_ = auVar113._24_4_ + auVar124._24_4_;
  auVar118._28_4_ = auVar113._28_4_ + auVar124._28_4_;
  auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar108 = vmulps_avx512vl(auVar110,auVar107);
  auVar109 = vmulps_avx512vl(auVar116,auVar107);
  auVar110 = vmulps_avx512vl(auVar118,auVar107);
  auVar107 = vsubps_avx(auVar108,auVar111);
  auVar108 = vsubps_avx(auVar109,auVar114);
  auVar109 = vsubps_avx(auVar110,auVar115);
  auVar109 = vmulps_avx512vl(auVar109,auVar106);
  auVar108 = vfmadd231ps_avx512vl(auVar109,auVar105,auVar108);
  auVar107 = vfmadd231ps_avx512vl(auVar108,auVar104,auVar107);
  auVar142._0_4_ = auVar107._0_4_ * auVar101._0_4_;
  auVar142._4_4_ = auVar107._4_4_ * auVar101._4_4_;
  auVar142._8_4_ = auVar107._8_4_ * auVar101._8_4_;
  auVar142._12_4_ = auVar107._12_4_ * auVar101._12_4_;
  auVar142._16_4_ = auVar107._16_4_ * 0.0;
  auVar142._20_4_ = auVar107._20_4_ * 0.0;
  auVar142._24_4_ = auVar107._24_4_ * 0.0;
  auVar142._28_4_ = 0;
  auVar107 = vmulps_avx512vl(auVar104,auVar142);
  auVar108 = vmulps_avx512vl(auVar105,auVar142);
  auVar109 = vmulps_avx512vl(auVar106,auVar142);
  auVar162._0_4_ = auVar107._0_4_ + fVar9;
  auVar162._4_4_ = auVar107._4_4_ + fVar9;
  auVar162._8_4_ = auVar107._8_4_ + fVar9;
  auVar162._12_4_ = auVar107._12_4_ + fVar9;
  auVar162._16_4_ = auVar107._16_4_ + fVar9;
  auVar162._20_4_ = auVar107._20_4_ + fVar9;
  auVar162._24_4_ = auVar107._24_4_ + fVar9;
  auVar162._28_4_ = auVar107._28_4_ + fVar9;
  auVar166._0_4_ = fVar10 + auVar108._0_4_;
  auVar166._4_4_ = fVar10 + auVar108._4_4_;
  auVar166._8_4_ = fVar10 + auVar108._8_4_;
  auVar166._12_4_ = fVar10 + auVar108._12_4_;
  auVar166._16_4_ = fVar10 + auVar108._16_4_;
  auVar166._20_4_ = fVar10 + auVar108._20_4_;
  auVar166._24_4_ = fVar10 + auVar108._24_4_;
  auVar166._28_4_ = fVar10 + auVar108._28_4_;
  auVar107 = vaddps_avx512vl(auVar115,auVar109);
  auVar109 = vsubps_avx512vl(auVar128,auVar117);
  auVar178 = ZEXT3264(auVar109);
  auVar110 = vsubps_avx512vl(auVar123,auVar112);
  auVar179 = ZEXT3264(auVar110);
  auVar111 = vsubps_avx512vl(auVar124,auVar113);
  auVar180 = ZEXT3264(auVar111);
  _local_5a0 = vsubps_avx(auVar162,auVar117);
  auVar112 = vsubps_avx512vl(auVar166,auVar112);
  auVar181 = ZEXT3264(auVar112);
  _local_5c0 = vsubps_avx512vl(auVar107,auVar113);
  auVar108 = vmulps_avx512vl(auVar111,auVar111);
  auVar108 = vfmadd231ps_avx512vl(auVar108,auVar110,auVar110);
  auVar113 = vfmadd231ps_avx512vl(auVar108,auVar109,auVar109);
  auVar108 = vmulps_avx512vl(auVar111,_local_5c0);
  auVar108 = vfmadd231ps_avx512vl(auVar108,auVar112,auVar110);
  auVar114 = vfmadd231ps_avx512vl(auVar108,_local_5a0,auVar109);
  auVar108 = vmulps_avx512vl(auVar111,auVar106);
  auVar108 = vfmadd231ps_avx512vl(auVar108,auVar105,auVar110);
  auVar115 = vfmadd231ps_avx512vl(auVar108,auVar104,auVar109);
  auVar116 = vsubps_avx512vl(auVar135,auVar103);
  fVar9 = auVar116._0_4_;
  fVar70 = auVar116._4_4_;
  fVar72 = auVar116._8_4_;
  fVar74 = auVar116._12_4_;
  fVar76 = auVar116._16_4_;
  fVar78 = auVar116._20_4_;
  fVar80 = auVar116._24_4_;
  auVar145._0_4_ = fVar9 * fVar9 + auVar113._0_4_;
  auVar145._4_4_ = fVar70 * fVar70 + auVar113._4_4_;
  auVar145._8_4_ = fVar72 * fVar72 + auVar113._8_4_;
  auVar145._12_4_ = fVar74 * fVar74 + auVar113._12_4_;
  auVar145._16_4_ = fVar76 * fVar76 + auVar113._16_4_;
  auVar145._20_4_ = fVar78 * fVar78 + auVar113._20_4_;
  auVar145._24_4_ = fVar80 * fVar80 + auVar113._24_4_;
  auVar145._28_4_ = auVar117._28_4_ + auVar113._28_4_;
  auVar108 = vmulps_avx512vl(auVar106,_local_5c0);
  auVar108 = vfmadd231ps_avx512vl(auVar108,auVar105,auVar112);
  auVar117 = vfmadd231ps_avx512vl(auVar108,auVar104,_local_5a0);
  auVar108 = vmulps_avx512vl(_local_5c0,_local_5c0);
  auVar108 = vfmadd231ps_avx512vl(auVar108,auVar112,auVar112);
  auVar118 = vfmadd231ps_avx512vl(auVar108,_local_5a0,_local_5a0);
  auVar119 = vmulps_avx512vl(auVar113,auVar113);
  auVar182 = ZEXT3264(auVar119);
  auVar120 = vmulps_avx512vl(auVar135,auVar113);
  fVar10 = auVar115._0_4_;
  fVar71 = auVar115._4_4_;
  auVar108._4_4_ = fVar71 * fVar71;
  auVar108._0_4_ = fVar10 * fVar10;
  fVar73 = auVar115._8_4_;
  auVar108._8_4_ = fVar73 * fVar73;
  fVar75 = auVar115._12_4_;
  auVar108._12_4_ = fVar75 * fVar75;
  fVar77 = auVar115._16_4_;
  auVar108._16_4_ = fVar77 * fVar77;
  fVar79 = auVar115._20_4_;
  auVar108._20_4_ = fVar79 * fVar79;
  fVar81 = auVar115._24_4_;
  auVar108._24_4_ = fVar81 * fVar81;
  auVar108._28_4_ = local_5c0._28_4_;
  auVar121 = vmulps_avx512vl(auVar145,auVar108);
  auVar121 = vsubps_avx512vl(auVar119,auVar121);
  auVar117 = vmulps_avx512vl(auVar119,auVar117);
  auVar122 = vmulps_avx512vl(auVar115,auVar114);
  auVar122 = vmulps_avx512vl(auVar145,auVar122);
  auVar117 = vsubps_avx512vl(auVar117,auVar122);
  auVar122 = vmulps_avx512vl(auVar116,auVar115);
  auVar122 = vmulps_avx512vl(auVar120,auVar122);
  auVar117 = vaddps_avx512vl(auVar122,auVar117);
  auVar118 = vmulps_avx512vl(auVar119,auVar118);
  auVar122 = vmulps_avx512vl(auVar114,auVar114);
  auVar122 = vmulps_avx512vl(auVar145,auVar122);
  auVar118 = vsubps_avx512vl(auVar118,auVar122);
  auVar116 = vaddps_avx512vl(auVar116,auVar116);
  auVar116 = vmulps_avx512vl(auVar116,auVar114);
  auVar116 = vsubps_avx512vl(auVar116,auVar120);
  auVar116 = vmulps_avx512vl(auVar120,auVar116);
  auVar116 = vaddps_avx512vl(auVar118,auVar116);
  auVar118 = vmulps_avx512vl(auVar117,auVar117);
  auVar116 = vmulps_avx512vl(auVar121,auVar116);
  auVar116 = vsubps_avx512vl(auVar118,auVar116);
  uVar96 = vcmpps_avx512vl(auVar116,ZEXT1632(auVar102),5);
  bVar98 = (byte)(uVar87 & uVar96);
  if (bVar98 != 0) {
    auVar128 = vsubps_avx(auVar162,auVar128);
    auVar123 = vsubps_avx512vl(auVar166,auVar123);
    auVar124 = vsubps_avx512vl(auVar107,auVar124);
    auVar116 = vsqrtps_avx512vl(auVar116);
    auVar107 = vrcp14ps_avx512vl(auVar121);
    auVar149._8_4_ = 0x3f800000;
    auVar149._0_8_ = 0x3f8000003f800000;
    auVar149._12_4_ = 0x3f800000;
    auVar149._16_4_ = 0x3f800000;
    auVar149._20_4_ = 0x3f800000;
    auVar149._24_4_ = 0x3f800000;
    auVar149._28_4_ = 0x3f800000;
    auVar118 = vfnmadd213ps_avx512vl(auVar107,auVar121,auVar149);
    auVar101 = vfmadd132ps_fma(auVar118,auVar107,auVar107);
    auVar120._8_4_ = 0x7fffffff;
    auVar120._0_8_ = 0x7fffffff7fffffff;
    auVar120._12_4_ = 0x7fffffff;
    auVar120._16_4_ = 0x7fffffff;
    auVar120._20_4_ = 0x7fffffff;
    auVar120._24_4_ = 0x7fffffff;
    auVar120._28_4_ = 0x7fffffff;
    vandps_avx512vl(auVar121,auVar120);
    auVar121._8_4_ = 0x219392ef;
    auVar121._0_8_ = 0x219392ef219392ef;
    auVar121._12_4_ = 0x219392ef;
    auVar121._16_4_ = 0x219392ef;
    auVar121._20_4_ = 0x219392ef;
    auVar121._24_4_ = 0x219392ef;
    auVar121._28_4_ = 0x219392ef;
    uVar99 = vcmpps_avx512vl(auVar118,auVar121,2);
    auVar148._8_4_ = 0x80000000;
    auVar148._0_8_ = 0x8000000080000000;
    auVar148._12_4_ = 0x80000000;
    auVar148._16_4_ = 0x80000000;
    auVar148._20_4_ = 0x80000000;
    auVar148._24_4_ = 0x80000000;
    auVar148._28_4_ = 0x80000000;
    auVar107 = vxorps_avx512vl(auVar117,auVar148);
    auVar107 = vsubps_avx(auVar107,auVar116);
    auVar107 = vmulps_avx512vl(auVar107,ZEXT1632(auVar101));
    auVar158._8_4_ = 0xff800000;
    auVar158._0_8_ = 0xff800000ff800000;
    auVar158._12_4_ = 0xff800000;
    auVar158._16_4_ = 0xff800000;
    auVar158._20_4_ = 0xff800000;
    auVar158._24_4_ = 0xff800000;
    auVar158._28_4_ = 0xff800000;
    bVar95 = (bool)((byte)uVar99 & 1);
    auVar125._0_4_ = (uint)bVar95 * -0x800000 | (uint)!bVar95 * auVar107._0_4_;
    bVar95 = (bool)((byte)(uVar99 >> 1) & 1);
    auVar125._4_4_ = (uint)bVar95 * -0x800000 | (uint)!bVar95 * auVar107._4_4_;
    bVar95 = (bool)((byte)(uVar99 >> 2) & 1);
    auVar125._8_4_ = (uint)bVar95 * -0x800000 | (uint)!bVar95 * auVar107._8_4_;
    bVar95 = (bool)((byte)(uVar99 >> 3) & 1);
    auVar125._12_4_ = (uint)bVar95 * -0x800000 | (uint)!bVar95 * auVar107._12_4_;
    bVar95 = (bool)((byte)(uVar99 >> 4) & 1);
    auVar125._16_4_ = (uint)bVar95 * -0x800000 | (uint)!bVar95 * auVar107._16_4_;
    bVar95 = (bool)((byte)(uVar99 >> 5) & 1);
    auVar125._20_4_ = (uint)bVar95 * -0x800000 | (uint)!bVar95 * auVar107._20_4_;
    bVar95 = (bool)((byte)(uVar99 >> 6) & 1);
    auVar125._24_4_ = (uint)bVar95 * -0x800000 | (uint)!bVar95 * auVar107._24_4_;
    bVar95 = SUB81(uVar99 >> 7,0);
    auVar125._28_4_ = (uint)bVar95 * -0x800000 | (uint)!bVar95 * auVar107._28_4_;
    auVar107 = vsubps_avx512vl(auVar116,auVar117);
    auVar163._8_4_ = 0x7f800000;
    auVar163._0_8_ = 0x7f8000007f800000;
    auVar163._12_4_ = 0x7f800000;
    auVar163._16_4_ = 0x7f800000;
    auVar163._20_4_ = 0x7f800000;
    auVar163._24_4_ = 0x7f800000;
    auVar163._28_4_ = 0x7f800000;
    bVar95 = (bool)((byte)uVar99 & 1);
    auVar126._0_4_ =
         (uint)bVar95 * 0x7f800000 | (uint)!bVar95 * (int)(auVar107._0_4_ * auVar101._0_4_);
    bVar95 = (bool)((byte)(uVar99 >> 1) & 1);
    auVar126._4_4_ =
         (uint)bVar95 * 0x7f800000 | (uint)!bVar95 * (int)(auVar107._4_4_ * auVar101._4_4_);
    bVar95 = (bool)((byte)(uVar99 >> 2) & 1);
    auVar126._8_4_ =
         (uint)bVar95 * 0x7f800000 | (uint)!bVar95 * (int)(auVar107._8_4_ * auVar101._8_4_);
    bVar95 = (bool)((byte)(uVar99 >> 3) & 1);
    auVar126._12_4_ =
         (uint)bVar95 * 0x7f800000 | (uint)!bVar95 * (int)(auVar107._12_4_ * auVar101._12_4_);
    bVar95 = (bool)((byte)(uVar99 >> 4) & 1);
    auVar126._16_4_ = (uint)bVar95 * 0x7f800000 | (uint)!bVar95 * (int)(auVar107._16_4_ * 0.0);
    bVar95 = (bool)((byte)(uVar99 >> 5) & 1);
    auVar126._20_4_ = (uint)bVar95 * 0x7f800000 | (uint)!bVar95 * (int)(auVar107._20_4_ * 0.0);
    bVar95 = (bool)((byte)(uVar99 >> 6) & 1);
    auVar126._24_4_ = (uint)bVar95 * 0x7f800000 | (uint)!bVar95 * (int)(auVar107._24_4_ * 0.0);
    bVar95 = SUB81(uVar99 >> 7,0);
    auVar126._28_4_ = (uint)bVar95 * 0x7f800000 | (uint)!bVar95 * (int)auVar166._28_4_;
    auVar122._4_4_ = fVar71 * (float)local_5a0._4_4_;
    auVar122._0_4_ = fVar10 * (float)local_5a0._0_4_;
    auVar122._8_4_ = fVar73 * fStack_598;
    auVar122._12_4_ = fVar75 * fStack_594;
    auVar122._16_4_ = fVar77 * fStack_590;
    auVar122._20_4_ = fVar79 * fStack_58c;
    auVar122._24_4_ = fVar81 * fStack_588;
    auVar122._28_4_ = auVar107._28_4_;
    auVar107 = vmulps_avx512vl(auVar115,auVar112);
    auVar117 = vmulps_avx512vl(auVar115,_local_5c0);
    auVar101 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
    auVar116 = vmulps_avx512vl(auVar104,auVar114);
    auVar116 = vsubps_avx512vl(auVar122,auVar116);
    auVar118 = vmulps_avx512vl(auVar105,auVar114);
    auVar107 = vsubps_avx512vl(auVar107,auVar118);
    auVar118 = vmulps_avx512vl(auVar106,auVar114);
    auVar117 = vsubps_avx512vl(auVar117,auVar118);
    auVar118 = vmulps_avx512vl(auVar115,auVar125);
    auVar160._0_4_ = auVar114._0_4_ + auVar118._0_4_;
    auVar160._4_4_ = auVar114._4_4_ + auVar118._4_4_;
    auVar160._8_4_ = auVar114._8_4_ + auVar118._8_4_;
    auVar160._12_4_ = auVar114._12_4_ + auVar118._12_4_;
    auVar160._16_4_ = auVar114._16_4_ + auVar118._16_4_;
    auVar160._20_4_ = auVar114._20_4_ + auVar118._20_4_;
    auVar160._24_4_ = auVar114._24_4_ + auVar118._24_4_;
    auVar160._28_4_ = auVar114._28_4_ + auVar118._28_4_;
    auVar117 = vmulps_avx512vl(auVar117,auVar117);
    auVar107 = vfmadd231ps_avx512vl(auVar117,auVar107,auVar107);
    auVar117 = vmulps_avx512vl(auVar115,auVar126);
    auVar117 = vaddps_avx512vl(auVar114,auVar117);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar116,auVar116);
    auVar116 = vmulps_avx512vl(auVar135,auVar135);
    auVar108 = vmulps_avx512vl(auVar116,auVar108);
    uVar99 = vcmpps_avx512vl(auVar107,auVar108,1);
    uVar99 = (bVar98 & ~(byte)line->leftExists) & uVar99;
    auVar107 = vrcp14ps_avx512vl(auVar115);
    auVar108 = vfnmadd213ps_avx512vl(auVar107,auVar115,auVar149);
    auVar107 = vfmadd132ps_avx512vl(auVar108,auVar107,auVar107);
    auVar172 = ZEXT3264(auVar117);
    auVar154._0_8_ = auVar114._0_8_ ^ 0x8000000080000000;
    auVar154._8_4_ = -auVar114._8_4_;
    auVar154._12_4_ = -auVar114._12_4_;
    auVar154._16_4_ = -auVar114._16_4_;
    auVar154._20_4_ = -auVar114._20_4_;
    auVar154._24_4_ = -auVar114._24_4_;
    auVar154._28_4_ = -auVar114._28_4_;
    auVar108 = vmulps_avx512vl(auVar107,auVar154);
    bVar95 = (bool)((byte)uVar99 & 1);
    auVar127._0_4_ = (uint)bVar95 * auVar108._0_4_ | (uint)!bVar95 * 0x7f800000;
    bVar95 = (bool)((byte)(uVar99 >> 1) & 1);
    auVar127._4_4_ = (uint)bVar95 * auVar108._4_4_ | (uint)!bVar95 * 0x7f800000;
    bVar95 = (bool)((byte)(uVar99 >> 2) & 1);
    auVar127._8_4_ = (uint)bVar95 * auVar108._8_4_ | (uint)!bVar95 * 0x7f800000;
    bVar95 = (bool)((byte)(uVar99 >> 3) & 1);
    auVar127._12_4_ = (uint)bVar95 * auVar108._12_4_ | (uint)!bVar95 * 0x7f800000;
    bVar95 = (bool)((byte)(uVar99 >> 4) & 1);
    auVar127._16_4_ = (uint)bVar95 * auVar108._16_4_ | (uint)!bVar95 * 0x7f800000;
    bVar95 = (bool)((byte)(uVar99 >> 5) & 1);
    auVar127._20_4_ = (uint)bVar95 * auVar108._20_4_ | (uint)!bVar95 * 0x7f800000;
    bVar95 = (bool)((byte)(uVar99 >> 6) & 1);
    auVar127._24_4_ = (uint)bVar95 * auVar108._24_4_ | (uint)!bVar95 * 0x7f800000;
    bVar95 = SUB81(uVar99 >> 7,0);
    auVar127._28_4_ = (uint)bVar95 * auVar108._28_4_ | (uint)!bVar95 * 0x7f800000;
    uVar82 = vcmpps_avx512vl(auVar160,auVar113,1);
    uVar83 = vcmpps_avx512vl(auVar160,ZEXT1632(auVar101),6);
    uVar84 = vcmpps_avx512vl(auVar117,auVar113,1);
    uVar85 = vcmpps_avx512vl(auVar117,ZEXT1632(auVar101),6);
    auVar108 = vmulps_avx512vl(auVar111,auVar124);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar123,auVar110);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar128,auVar109);
    auVar91._4_4_ = fVar71 * auVar128._4_4_;
    auVar91._0_4_ = fVar10 * auVar128._0_4_;
    auVar91._8_4_ = fVar73 * auVar128._8_4_;
    auVar91._12_4_ = fVar75 * auVar128._12_4_;
    auVar91._16_4_ = fVar77 * auVar128._16_4_;
    auVar91._20_4_ = fVar79 * auVar128._20_4_;
    auVar91._24_4_ = fVar81 * auVar128._24_4_;
    auVar91._28_4_ = auVar154._28_4_;
    auVar123 = vmulps_avx512vl(auVar115,auVar123);
    auVar128 = vmulps_avx512vl(auVar115,auVar124);
    auVar114 = vmulps_avx512vl(auVar104,auVar108);
    auVar114 = vsubps_avx512vl(auVar91,auVar114);
    auVar115 = vmulps_avx512vl(auVar105,auVar108);
    auVar123 = vsubps_avx512vl(auVar123,auVar115);
    auVar115 = vmulps_avx512vl(auVar106,auVar108);
    auVar128 = vsubps_avx512vl(auVar128,auVar115);
    auVar169 = ZEXT3264(auVar127);
    auVar92._4_4_ = auVar128._4_4_ * auVar128._4_4_;
    auVar92._0_4_ = auVar128._0_4_ * auVar128._0_4_;
    auVar92._8_4_ = auVar128._8_4_ * auVar128._8_4_;
    auVar92._12_4_ = auVar128._12_4_ * auVar128._12_4_;
    auVar92._16_4_ = auVar128._16_4_ * auVar128._16_4_;
    auVar92._20_4_ = auVar128._20_4_ * auVar128._20_4_;
    auVar92._24_4_ = auVar128._24_4_ * auVar128._24_4_;
    auVar92._28_4_ = auVar128._28_4_;
    auVar101 = vfmadd231ps_fma(auVar92,auVar123,auVar123);
    auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar114,auVar114);
    auVar123 = vmulps_avx512vl(auVar103,auVar103);
    auVar93._4_4_ = fVar71 * fVar71 * auVar123._4_4_;
    auVar93._0_4_ = fVar10 * fVar10 * auVar123._0_4_;
    auVar93._8_4_ = fVar73 * fVar73 * auVar123._8_4_;
    auVar93._12_4_ = fVar75 * fVar75 * auVar123._12_4_;
    auVar93._16_4_ = fVar77 * fVar77 * auVar123._16_4_;
    auVar93._20_4_ = fVar79 * fVar79 * auVar123._20_4_;
    auVar93._24_4_ = fVar81 * fVar81 * auVar123._24_4_;
    auVar93._28_4_ = auVar123._28_4_;
    uVar11 = *(undefined4 *)(ray + k * 4 + 0x60);
    auVar155._4_4_ = uVar11;
    auVar155._0_4_ = uVar11;
    auVar155._8_4_ = uVar11;
    auVar155._12_4_ = uVar11;
    auVar155._16_4_ = uVar11;
    auVar155._20_4_ = uVar11;
    auVar155._24_4_ = uVar11;
    auVar155._28_4_ = uVar11;
    bVar88 = (byte)uVar82 & (byte)uVar83 & bVar98;
    auVar123 = vblendmps_avx512vl(auVar163,auVar125);
    auVar129._0_4_ =
         (uint)(bVar88 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar124._0_4_;
    bVar95 = (bool)(bVar88 >> 1 & 1);
    auVar129._4_4_ = (uint)bVar95 * auVar123._4_4_ | (uint)!bVar95 * auVar124._4_4_;
    bVar95 = (bool)(bVar88 >> 2 & 1);
    auVar129._8_4_ = (uint)bVar95 * auVar123._8_4_ | (uint)!bVar95 * auVar124._8_4_;
    bVar95 = (bool)(bVar88 >> 3 & 1);
    auVar129._12_4_ = (uint)bVar95 * auVar123._12_4_ | (uint)!bVar95 * auVar124._12_4_;
    bVar95 = (bool)(bVar88 >> 4 & 1);
    auVar129._16_4_ = (uint)bVar95 * auVar123._16_4_ | (uint)!bVar95 * auVar124._16_4_;
    bVar95 = (bool)(bVar88 >> 5 & 1);
    auVar129._20_4_ = (uint)bVar95 * auVar123._20_4_ | (uint)!bVar95 * auVar124._20_4_;
    bVar95 = (bool)(bVar88 >> 6 & 1);
    auVar129._24_4_ = (uint)bVar95 * auVar123._24_4_ | (uint)!bVar95 * auVar124._24_4_;
    auVar129._28_4_ =
         (uint)(bVar88 >> 7) * auVar123._28_4_ | (uint)!(bool)(bVar88 >> 7) * auVar124._28_4_;
    auVar170 = ZEXT3264(auVar129);
    auVar150._0_8_ = auVar108._0_8_ ^ 0x8000000080000000;
    auVar150._8_4_ = auVar108._8_4_ ^ 0x80000000;
    auVar150._12_4_ = auVar108._12_4_ ^ 0x80000000;
    auVar150._16_4_ = auVar108._16_4_ ^ 0x80000000;
    auVar150._20_4_ = auVar108._20_4_ ^ 0x80000000;
    auVar150._24_4_ = auVar108._24_4_ ^ 0x80000000;
    auVar150._28_4_ = auVar108._28_4_ ^ 0x80000000;
    uVar99 = vcmpps_avx512vl(ZEXT1632(auVar101),auVar93,1);
    uVar99 = (bVar98 & ~(byte)line->rightExists) & uVar99;
    auVar107 = vmulps_avx512vl(auVar107,auVar150);
    bVar95 = (bool)((byte)uVar99 & 1);
    auVar130._0_4_ = (uint)bVar95 * auVar107._0_4_ | (uint)!bVar95 * 0x7f800000;
    bVar95 = (bool)((byte)(uVar99 >> 1) & 1);
    auVar130._4_4_ = (uint)bVar95 * auVar107._4_4_ | (uint)!bVar95 * 0x7f800000;
    bVar95 = (bool)((byte)(uVar99 >> 2) & 1);
    auVar130._8_4_ = (uint)bVar95 * auVar107._8_4_ | (uint)!bVar95 * 0x7f800000;
    bVar95 = (bool)((byte)(uVar99 >> 3) & 1);
    auVar130._12_4_ = (uint)bVar95 * auVar107._12_4_ | (uint)!bVar95 * 0x7f800000;
    bVar95 = (bool)((byte)(uVar99 >> 4) & 1);
    auVar130._16_4_ = (uint)bVar95 * auVar107._16_4_ | (uint)!bVar95 * 0x7f800000;
    bVar95 = (bool)((byte)(uVar99 >> 5) & 1);
    auVar130._20_4_ = (uint)bVar95 * auVar107._20_4_ | (uint)!bVar95 * 0x7f800000;
    bVar95 = (bool)((byte)(uVar99 >> 6) & 1);
    auVar130._24_4_ = (uint)bVar95 * auVar107._24_4_ | (uint)!bVar95 * 0x7f800000;
    bVar95 = SUB81(uVar99 >> 7,0);
    auVar130._28_4_ = (uint)bVar95 * auVar107._28_4_ | (uint)!bVar95 * 0x7f800000;
    auVar107 = vminps_avx512vl(auVar127,auVar130);
    auVar108 = vmaxps_avx512vl(auVar127,auVar130);
    auVar123 = vminps_avx512vl(auVar129,auVar107);
    uVar99 = vcmpps_avx512vl(auVar123,auVar107,0);
    uVar86 = vcmpps_avx512vl(auVar108,auVar163,0);
    bVar95 = (bool)((byte)uVar86 & 1);
    bVar27 = (bool)((byte)(uVar86 >> 1) & 1);
    bVar29 = (bool)((byte)(uVar86 >> 2) & 1);
    bVar31 = (bool)((byte)(uVar86 >> 3) & 1);
    bVar38 = (bool)((byte)(uVar86 >> 4) & 1);
    bVar47 = (bool)((byte)(uVar86 >> 5) & 1);
    bVar56 = (bool)((byte)(uVar86 >> 6) & 1);
    bVar65 = SUB81(uVar86 >> 7,0);
    uVar86 = vcmpps_avx512vl(auVar107,auVar163,0);
    bVar25 = (bool)((byte)uVar86 & 1);
    bVar28 = (bool)((byte)(uVar86 >> 1) & 1);
    bVar30 = (bool)((byte)(uVar86 >> 2) & 1);
    bVar32 = (bool)((byte)(uVar86 >> 3) & 1);
    bVar39 = (bool)((byte)(uVar86 >> 4) & 1);
    bVar48 = (bool)((byte)(uVar86 >> 5) & 1);
    bVar57 = (bool)((byte)(uVar86 >> 6) & 1);
    bVar66 = SUB81(uVar86 >> 7,0);
    bVar26 = (bool)((byte)uVar99 & 1);
    auVar131._0_4_ =
         (uint)bVar26 * ((uint)bVar95 * -0x800000 | (uint)!bVar95 * auVar108._0_4_) |
         (uint)!bVar26 * ((uint)bVar25 * -0x800000 | (uint)!bVar25 * auVar107._0_4_);
    bVar95 = (bool)((byte)(uVar99 >> 1) & 1);
    auVar131._4_4_ =
         (uint)bVar95 * ((uint)bVar27 * -0x800000 | (uint)!bVar27 * auVar108._4_4_) |
         (uint)!bVar95 * ((uint)bVar28 * -0x800000 | (uint)!bVar28 * auVar107._4_4_);
    bVar95 = (bool)((byte)(uVar99 >> 2) & 1);
    auVar131._8_4_ =
         (uint)bVar95 * ((uint)bVar29 * -0x800000 | (uint)!bVar29 * auVar108._8_4_) |
         (uint)!bVar95 * ((uint)bVar30 * -0x800000 | (uint)!bVar30 * auVar107._8_4_);
    bVar95 = (bool)((byte)(uVar99 >> 3) & 1);
    auVar131._12_4_ =
         (uint)bVar95 * ((uint)bVar31 * -0x800000 | (uint)!bVar31 * auVar108._12_4_) |
         (uint)!bVar95 * ((uint)bVar32 * -0x800000 | (uint)!bVar32 * auVar107._12_4_);
    bVar95 = (bool)((byte)(uVar99 >> 4) & 1);
    auVar131._16_4_ =
         (uint)bVar95 * ((uint)bVar38 * -0x800000 | (uint)!bVar38 * auVar108._16_4_) |
         (uint)!bVar95 * ((uint)bVar39 * -0x800000 | (uint)!bVar39 * auVar107._16_4_);
    bVar95 = (bool)((byte)(uVar99 >> 5) & 1);
    auVar131._20_4_ =
         (uint)bVar95 * ((uint)bVar47 * -0x800000 | (uint)!bVar47 * auVar108._20_4_) |
         (uint)!bVar95 * ((uint)bVar48 * -0x800000 | (uint)!bVar48 * auVar107._20_4_);
    bVar95 = (bool)((byte)(uVar99 >> 6) & 1);
    auVar131._24_4_ =
         (uint)bVar95 * ((uint)bVar56 * -0x800000 | (uint)!bVar56 * auVar108._24_4_) |
         (uint)!bVar95 * ((uint)bVar57 * -0x800000 | (uint)!bVar57 * auVar107._24_4_);
    bVar95 = SUB81(uVar99 >> 7,0);
    auVar131._28_4_ =
         (uint)bVar95 * ((uint)bVar65 * -0x800000 | (uint)!bVar65 * auVar108._28_4_) |
         (uint)!bVar95 * ((uint)bVar66 * -0x800000 | (uint)!bVar66 * auVar107._28_4_);
    auVar152._0_4_ = auVar142._0_4_ + auVar123._0_4_;
    auVar152._4_4_ = auVar142._4_4_ + auVar123._4_4_;
    auVar152._8_4_ = auVar142._8_4_ + auVar123._8_4_;
    auVar152._12_4_ = auVar142._12_4_ + auVar123._12_4_;
    auVar152._16_4_ = auVar142._16_4_ + auVar123._16_4_;
    auVar152._20_4_ = auVar142._20_4_ + auVar123._20_4_;
    auVar152._24_4_ = auVar142._24_4_ + auVar123._24_4_;
    auVar152._28_4_ = auVar123._28_4_ + 0.0;
    uVar99 = vcmpps_avx512vl(auVar155,auVar152,2);
    uVar11 = *(undefined4 *)(ray + k * 4 + 0x100);
    local_5e0._4_4_ = uVar11;
    local_5e0._0_4_ = uVar11;
    local_5e0._8_4_ = uVar11;
    local_5e0._12_4_ = uVar11;
    local_5e0._16_4_ = uVar11;
    local_5e0._20_4_ = uVar11;
    local_5e0._24_4_ = uVar11;
    local_5e0._28_4_ = uVar11;
    uVar86 = vcmpps_avx512vl(auVar152,local_5e0,2);
    bVar88 = (byte)uVar84 & (byte)uVar85 & bVar98;
    auVar107 = vblendmps_avx512vl(auVar158,auVar126);
    auVar132._0_4_ = (uint)(bVar88 & 1) * auVar107._0_4_ | !(bool)(bVar88 & 1) * auVar125._0_4_;
    bVar95 = (bool)(bVar88 >> 1 & 1);
    auVar132._4_4_ = (uint)bVar95 * auVar107._4_4_ | !bVar95 * auVar125._4_4_;
    bVar95 = (bool)(bVar88 >> 2 & 1);
    auVar132._8_4_ = (uint)bVar95 * auVar107._8_4_ | !bVar95 * auVar125._8_4_;
    bVar95 = (bool)(bVar88 >> 3 & 1);
    auVar132._12_4_ = (uint)bVar95 * auVar107._12_4_ | !bVar95 * auVar125._12_4_;
    bVar95 = (bool)(bVar88 >> 4 & 1);
    auVar132._16_4_ = (uint)bVar95 * auVar107._16_4_ | !bVar95 * auVar125._16_4_;
    bVar95 = (bool)(bVar88 >> 5 & 1);
    auVar132._20_4_ = (uint)bVar95 * auVar107._20_4_ | !bVar95 * auVar125._20_4_;
    bVar95 = (bool)(bVar88 >> 6 & 1);
    auVar132._24_4_ = (uint)bVar95 * auVar107._24_4_ | !bVar95 * auVar125._24_4_;
    auVar132._28_4_ = (uint)(bVar88 >> 7) * auVar107._28_4_ | !(bool)(bVar88 >> 7) * auVar125._28_4_
    ;
    auVar171 = ZEXT3264(auVar132);
    auVar107 = vmaxps_avx512vl(auVar132,auVar131);
    auVar167 = ZEXT3264(auVar107);
    uVar100 = vcmpps_avx512vl(auVar123,auVar163,4);
    uVar100 = uVar99 & uVar86 & uVar100;
    auVar164._0_4_ = auVar107._0_4_ + auVar142._0_4_;
    auVar164._4_4_ = auVar107._4_4_ + auVar142._4_4_;
    auVar164._8_4_ = auVar107._8_4_ + auVar142._8_4_;
    auVar164._12_4_ = auVar107._12_4_ + auVar142._12_4_;
    auVar164._16_4_ = auVar107._16_4_ + auVar142._16_4_;
    auVar164._20_4_ = auVar107._20_4_ + auVar142._20_4_;
    auVar164._24_4_ = auVar107._24_4_ + auVar142._24_4_;
    auVar164._28_4_ = auVar107._28_4_ + 0.0;
    auVar165 = ZEXT3264(auVar164);
    uVar82 = vcmpps_avx512vl(auVar155,auVar164,2);
    uVar83 = vcmpps_avx512vl(auVar164,local_5e0,2);
    uVar84 = vcmpps_avx512vl(auVar107,auVar158,4);
    bVar97 = (byte)uVar82 & (byte)uVar83 & (byte)uVar84;
    bVar88 = (byte)uVar100 & bVar98;
    bVar89 = bVar97 & bVar98;
    if (bVar88 != 0 || bVar89 != 0) {
      auVar107 = vblendmps_avx512vl(auVar107,auVar123);
      auVar133._0_4_ =
           (float)((uint)(bVar88 & 1) * auVar107._0_4_ |
                  (uint)!(bool)(bVar88 & 1) * (int)auVar123._0_4_);
      bVar95 = (bool)(bVar88 >> 1 & 1);
      auVar133._4_4_ = (float)((uint)bVar95 * auVar107._4_4_ | (uint)!bVar95 * (int)auVar123._4_4_);
      bVar95 = (bool)(bVar88 >> 2 & 1);
      auVar133._8_4_ = (float)((uint)bVar95 * auVar107._8_4_ | (uint)!bVar95 * (int)auVar123._8_4_);
      bVar95 = (bool)(bVar88 >> 3 & 1);
      auVar133._12_4_ =
           (float)((uint)bVar95 * auVar107._12_4_ | (uint)!bVar95 * (int)auVar123._12_4_);
      bVar95 = (bool)(bVar88 >> 4 & 1);
      auVar133._16_4_ =
           (float)((uint)bVar95 * auVar107._16_4_ | (uint)!bVar95 * (int)auVar123._16_4_);
      bVar95 = (bool)(bVar88 >> 5 & 1);
      auVar133._20_4_ =
           (float)((uint)bVar95 * auVar107._20_4_ | (uint)!bVar95 * (int)auVar123._20_4_);
      bVar95 = (bool)(bVar88 >> 6 & 1);
      auVar133._24_4_ =
           (float)((uint)bVar95 * auVar107._24_4_ | (uint)!bVar95 * (int)auVar123._24_4_);
      auVar133._28_4_ =
           (float)((uint)(bVar88 >> 7) * auVar107._28_4_ |
                  (uint)!(bool)(bVar88 >> 7) * (int)auVar123._28_4_);
      uVar82 = vcmpps_avx512vl(auVar133,auVar129,0);
      uVar83 = vcmpps_avx512vl(auVar133,auVar132,0);
      auVar107 = vblendmps_avx512vl(auVar117,auVar160);
      auVar134._0_4_ =
           (float)((uint)(bVar88 & 1) * auVar107._0_4_ | !(bool)(bVar88 & 1) * auVar131._0_4_);
      bVar95 = (bool)(bVar88 >> 1 & 1);
      auVar134._4_4_ = (float)((uint)bVar95 * auVar107._4_4_ | !bVar95 * auVar131._4_4_);
      bVar95 = (bool)(bVar88 >> 2 & 1);
      auVar134._8_4_ = (float)((uint)bVar95 * auVar107._8_4_ | !bVar95 * auVar131._8_4_);
      bVar95 = (bool)(bVar88 >> 3 & 1);
      auVar134._12_4_ = (float)((uint)bVar95 * auVar107._12_4_ | !bVar95 * auVar131._12_4_);
      bVar95 = (bool)(bVar88 >> 4 & 1);
      auVar134._16_4_ = (float)((uint)bVar95 * auVar107._16_4_ | !bVar95 * auVar131._16_4_);
      bVar95 = (bool)(bVar88 >> 5 & 1);
      auVar134._20_4_ = (float)((uint)bVar95 * auVar107._20_4_ | !bVar95 * auVar131._20_4_);
      bVar95 = (bool)(bVar88 >> 6 & 1);
      auVar134._24_4_ = (float)((uint)bVar95 * auVar107._24_4_ | !bVar95 * auVar131._24_4_);
      auVar134._28_4_ =
           (uint)(bVar88 >> 7) * auVar107._28_4_ | !(bool)(bVar88 >> 7) * auVar131._28_4_;
      auVar94._4_4_ = auVar135._4_4_ * fVar70 * auVar113._4_4_;
      auVar94._0_4_ = auVar135._0_4_ * fVar9 * auVar113._0_4_;
      auVar94._8_4_ = auVar135._8_4_ * fVar72 * auVar113._8_4_;
      auVar94._12_4_ = auVar135._12_4_ * fVar74 * auVar113._12_4_;
      auVar94._16_4_ = auVar135._16_4_ * fVar76 * auVar113._16_4_;
      auVar94._20_4_ = auVar135._20_4_ * fVar78 * auVar113._20_4_;
      auVar94._24_4_ = auVar135._24_4_ * fVar80 * auVar113._24_4_;
      auVar94._28_4_ = auVar135._28_4_;
      auVar107 = vmulps_avx512vl(auVar109,auVar94);
      auVar159 = ZEXT3264(auVar107);
      auVar108 = vmulps_avx512vl(auVar110,auVar94);
      auVar161 = ZEXT3264(auVar108);
      auVar135 = vmulps_avx512vl(auVar111,auVar94);
      auVar173 = ZEXT3264(auVar135);
      local_80 = vmulps_avx512vl(auVar109,auVar145);
      local_a0 = vmulps_avx512vl(auVar110,auVar145);
      auVar117 = vmulps_avx512vl(auVar111,auVar145);
      bVar90 = ((byte)uVar82 | (byte)uVar83) & bVar98;
      uVar99 = vcmpps_avx512vl(auVar133,auVar127,0);
      uVar99 = uVar87 & uVar96 & uVar99;
      auVar123 = vmulps_avx512vl(auVar104,auVar133);
      auVar128 = vmulps_avx512vl(auVar105,auVar133);
      auVar124 = vmulps_avx512vl(auVar106,auVar133);
      auVar138._0_4_ = auVar123._0_4_ + (float)local_5a0._0_4_;
      auVar138._4_4_ = auVar123._4_4_ + (float)local_5a0._4_4_;
      auVar138._8_4_ = auVar123._8_4_ + fStack_598;
      auVar138._12_4_ = auVar123._12_4_ + fStack_594;
      auVar138._16_4_ = auVar123._16_4_ + fStack_590;
      auVar138._20_4_ = auVar123._20_4_ + fStack_58c;
      auVar138._24_4_ = auVar123._24_4_ + fStack_588;
      auVar138._28_4_ = auVar123._28_4_ + fStack_584;
      auVar112 = vaddps_avx512vl(auVar112,auVar128);
      auVar147._0_4_ = auVar124._0_4_ + (float)local_5c0._0_4_;
      auVar147._4_4_ = auVar124._4_4_ + (float)local_5c0._4_4_;
      auVar147._8_4_ = auVar124._8_4_ + fStack_5b8;
      auVar147._12_4_ = auVar124._12_4_ + fStack_5b4;
      auVar147._16_4_ = auVar124._16_4_ + fStack_5b0;
      auVar147._20_4_ = auVar124._20_4_ + fStack_5ac;
      auVar147._24_4_ = auVar124._24_4_ + fStack_5a8;
      auVar147._28_4_ = auVar124._28_4_ + local_5c0._28_4_;
      auVar123 = vmulps_avx512vl(auVar119,auVar138);
      auVar112 = vmulps_avx512vl(auVar119,auVar112);
      auVar128 = vmulps_avx512vl(auVar119,auVar147);
      auVar119._0_4_ = auVar107._0_4_ + auVar123._0_4_;
      auVar119._4_4_ = auVar107._4_4_ + auVar123._4_4_;
      auVar119._8_4_ = auVar107._8_4_ + auVar123._8_4_;
      auVar119._12_4_ = auVar107._12_4_ + auVar123._12_4_;
      auVar119._16_4_ = auVar107._16_4_ + auVar123._16_4_;
      auVar119._20_4_ = auVar107._20_4_ + auVar123._20_4_;
      auVar119._24_4_ = auVar107._24_4_ + auVar123._24_4_;
      auVar119._28_4_ = auVar107._28_4_ + auVar123._28_4_;
      auVar146._0_4_ = auVar108._0_4_ + auVar112._0_4_;
      auVar146._4_4_ = auVar108._4_4_ + auVar112._4_4_;
      auVar146._8_4_ = auVar108._8_4_ + auVar112._8_4_;
      auVar146._12_4_ = auVar108._12_4_ + auVar112._12_4_;
      auVar146._16_4_ = auVar108._16_4_ + auVar112._16_4_;
      auVar146._20_4_ = auVar108._20_4_ + auVar112._20_4_;
      auVar146._24_4_ = auVar108._24_4_ + auVar112._24_4_;
      auVar146._28_4_ = auVar108._28_4_ + auVar112._28_4_;
      auVar107 = vaddps_avx512vl(auVar135,auVar128);
      auVar104._4_4_ = local_80._4_4_ * auVar134._4_4_;
      auVar104._0_4_ = local_80._0_4_ * auVar134._0_4_;
      auVar104._8_4_ = local_80._8_4_ * auVar134._8_4_;
      auVar104._12_4_ = local_80._12_4_ * auVar134._12_4_;
      auVar104._16_4_ = local_80._16_4_ * auVar134._16_4_;
      auVar104._20_4_ = local_80._20_4_ * auVar134._20_4_;
      auVar104._24_4_ = local_80._24_4_ * auVar134._24_4_;
      auVar104._28_4_ = local_80._28_4_;
      auVar105._4_4_ = local_a0._4_4_ * auVar134._4_4_;
      auVar105._0_4_ = local_a0._0_4_ * auVar134._0_4_;
      auVar105._8_4_ = local_a0._8_4_ * auVar134._8_4_;
      auVar105._12_4_ = local_a0._12_4_ * auVar134._12_4_;
      auVar105._16_4_ = local_a0._16_4_ * auVar134._16_4_;
      auVar105._20_4_ = local_a0._20_4_ * auVar134._20_4_;
      auVar105._24_4_ = local_a0._24_4_ * auVar134._24_4_;
      auVar105._28_4_ = local_a0._28_4_;
      local_c0 = vxorps_avx512vl(auVar109,auVar148);
      auVar108 = vblendmps_avx512vl(auVar109,local_c0);
      bVar88 = (byte)uVar99;
      bVar95 = (bool)((byte)(uVar99 >> 1) & 1);
      bVar26 = (bool)((byte)(uVar99 >> 2) & 1);
      bVar27 = (bool)((byte)(uVar99 >> 3) & 1);
      bVar28 = (bool)((byte)(uVar99 >> 4) & 1);
      bVar29 = (bool)((byte)(uVar99 >> 5) & 1);
      bVar30 = (bool)((byte)(uVar99 >> 6) & 1);
      bVar31 = SUB81(uVar99 >> 7,0);
      auVar109 = vsubps_avx512vl(auVar119,auVar104);
      local_520._0_4_ =
           (uint)(bVar90 & 1) * auVar109._0_4_ |
           (uint)!(bool)(bVar90 & 1) *
           ((uint)(bVar88 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar88 & 1) * local_c0._0_4_);
      bVar25 = (bool)(bVar90 >> 1 & 1);
      local_520._4_4_ =
           (uint)bVar25 * auVar109._4_4_ |
           (uint)!bVar25 * ((uint)bVar95 * auVar108._4_4_ | (uint)!bVar95 * local_c0._4_4_);
      bVar95 = (bool)(bVar90 >> 2 & 1);
      local_520._8_4_ =
           (uint)bVar95 * auVar109._8_4_ |
           (uint)!bVar95 * ((uint)bVar26 * auVar108._8_4_ | (uint)!bVar26 * local_c0._8_4_);
      bVar95 = (bool)(bVar90 >> 3 & 1);
      local_520._12_4_ =
           (uint)bVar95 * auVar109._12_4_ |
           (uint)!bVar95 * ((uint)bVar27 * auVar108._12_4_ | (uint)!bVar27 * local_c0._12_4_);
      bVar95 = (bool)(bVar90 >> 4 & 1);
      local_520._16_4_ =
           (uint)bVar95 * auVar109._16_4_ |
           (uint)!bVar95 * ((uint)bVar28 * auVar108._16_4_ | (uint)!bVar28 * local_c0._16_4_);
      bVar95 = (bool)(bVar90 >> 5 & 1);
      local_520._20_4_ =
           (uint)bVar95 * auVar109._20_4_ |
           (uint)!bVar95 * ((uint)bVar29 * auVar108._20_4_ | (uint)!bVar29 * local_c0._20_4_);
      bVar95 = (bool)(bVar90 >> 6 & 1);
      local_520._24_4_ =
           (uint)bVar95 * auVar109._24_4_ |
           (uint)!bVar95 * ((uint)bVar30 * auVar108._24_4_ | (uint)!bVar30 * local_c0._24_4_);
      local_520._28_4_ =
           (uint)(bVar90 >> 7) * auVar109._28_4_ |
           (uint)!(bool)(bVar90 >> 7) *
           ((uint)bVar31 * auVar108._28_4_ | (uint)!bVar31 * local_c0._28_4_);
      auVar153 = ZEXT3264(auVar117);
      auVar108 = vxorps_avx512vl(auVar110,auVar148);
      auVar168 = ZEXT3264(auVar108);
      auVar108 = vblendmps_avx512vl(auVar110,auVar108);
      bVar95 = (bool)((byte)(uVar99 >> 1) & 1);
      bVar26 = (bool)((byte)(uVar99 >> 2) & 1);
      bVar27 = (bool)((byte)(uVar99 >> 3) & 1);
      bVar28 = (bool)((byte)(uVar99 >> 4) & 1);
      bVar29 = (bool)((byte)(uVar99 >> 5) & 1);
      bVar30 = (bool)((byte)(uVar99 >> 6) & 1);
      bVar31 = SUB81(uVar99 >> 7,0);
      auVar109 = vsubps_avx512vl(auVar146,auVar105);
      local_500._0_4_ =
           (uint)(bVar90 & 1) * auVar109._0_4_ |
           (uint)!(bool)(bVar90 & 1) *
           ((uint)(bVar88 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar88 & 1) * (int)auVar119._0_4_);
      bVar25 = (bool)(bVar90 >> 1 & 1);
      local_500._4_4_ =
           (uint)bVar25 * auVar109._4_4_ |
           (uint)!bVar25 * ((uint)bVar95 * auVar108._4_4_ | (uint)!bVar95 * (int)auVar119._4_4_);
      bVar95 = (bool)(bVar90 >> 2 & 1);
      local_500._8_4_ =
           (uint)bVar95 * auVar109._8_4_ |
           (uint)!bVar95 * ((uint)bVar26 * auVar108._8_4_ | (uint)!bVar26 * (int)auVar119._8_4_);
      bVar95 = (bool)(bVar90 >> 3 & 1);
      local_500._12_4_ =
           (uint)bVar95 * auVar109._12_4_ |
           (uint)!bVar95 * ((uint)bVar27 * auVar108._12_4_ | (uint)!bVar27 * (int)auVar119._12_4_);
      bVar95 = (bool)(bVar90 >> 4 & 1);
      local_500._16_4_ =
           (uint)bVar95 * auVar109._16_4_ |
           (uint)!bVar95 * ((uint)bVar28 * auVar108._16_4_ | (uint)!bVar28 * (int)auVar119._16_4_);
      bVar95 = (bool)(bVar90 >> 5 & 1);
      local_500._20_4_ =
           (uint)bVar95 * auVar109._20_4_ |
           (uint)!bVar95 * ((uint)bVar29 * auVar108._20_4_ | (uint)!bVar29 * (int)auVar119._20_4_);
      bVar95 = (bool)(bVar90 >> 6 & 1);
      local_500._24_4_ =
           (uint)bVar95 * auVar109._24_4_ |
           (uint)!bVar95 * ((uint)bVar30 * auVar108._24_4_ | (uint)!bVar30 * (int)auVar119._24_4_);
      local_500._28_4_ =
           (uint)(bVar90 >> 7) * auVar109._28_4_ |
           (uint)!(bool)(bVar90 >> 7) *
           ((uint)bVar31 * auVar108._28_4_ | (uint)!bVar31 * (int)auVar119._28_4_);
      auVar106._4_4_ = auVar117._4_4_ * auVar134._4_4_;
      auVar106._0_4_ = auVar117._0_4_ * auVar134._0_4_;
      auVar106._8_4_ = auVar117._8_4_ * auVar134._8_4_;
      auVar106._12_4_ = auVar117._12_4_ * auVar134._12_4_;
      auVar106._16_4_ = auVar117._16_4_ * auVar134._16_4_;
      auVar106._20_4_ = auVar117._20_4_ * auVar134._20_4_;
      auVar106._24_4_ = auVar117._24_4_ * auVar134._24_4_;
      auVar106._28_4_ = auVar146._28_4_;
      local_e0 = vxorps_avx512vl(auVar111,auVar148);
      auVar108 = vblendmps_avx512vl(auVar111,local_e0);
      bVar95 = (bool)((byte)(uVar99 >> 1) & 1);
      bVar26 = (bool)((byte)(uVar99 >> 2) & 1);
      bVar27 = (bool)((byte)(uVar99 >> 3) & 1);
      bVar28 = (bool)((byte)(uVar99 >> 4) & 1);
      bVar29 = (bool)((byte)(uVar99 >> 5) & 1);
      bVar30 = (bool)((byte)(uVar99 >> 6) & 1);
      bVar31 = SUB81(uVar99 >> 7,0);
      auVar107 = vsubps_avx512vl(auVar107,auVar106);
      local_4e0._0_4_ =
           (uint)(bVar90 & 1) * auVar107._0_4_ |
           (uint)!(bool)(bVar90 & 1) *
           ((uint)(bVar88 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar88 & 1) * local_e0._0_4_);
      bVar25 = (bool)(bVar90 >> 1 & 1);
      local_4e0._4_4_ =
           (uint)bVar25 * auVar107._4_4_ |
           (uint)!bVar25 * ((uint)bVar95 * auVar108._4_4_ | (uint)!bVar95 * local_e0._4_4_);
      bVar95 = (bool)(bVar90 >> 2 & 1);
      local_4e0._8_4_ =
           (uint)bVar95 * auVar107._8_4_ |
           (uint)!bVar95 * ((uint)bVar26 * auVar108._8_4_ | (uint)!bVar26 * local_e0._8_4_);
      bVar95 = (bool)(bVar90 >> 3 & 1);
      local_4e0._12_4_ =
           (uint)bVar95 * auVar107._12_4_ |
           (uint)!bVar95 * ((uint)bVar27 * auVar108._12_4_ | (uint)!bVar27 * local_e0._12_4_);
      bVar95 = (bool)(bVar90 >> 4 & 1);
      local_4e0._16_4_ =
           (uint)bVar95 * auVar107._16_4_ |
           (uint)!bVar95 * ((uint)bVar28 * auVar108._16_4_ | (uint)!bVar28 * local_e0._16_4_);
      bVar95 = (bool)(bVar90 >> 5 & 1);
      local_4e0._20_4_ =
           (uint)bVar95 * auVar107._20_4_ |
           (uint)!bVar95 * ((uint)bVar29 * auVar108._20_4_ | (uint)!bVar29 * local_e0._20_4_);
      bVar95 = (bool)(bVar90 >> 6 & 1);
      local_4e0._24_4_ =
           (uint)bVar95 * auVar107._24_4_ |
           (uint)!bVar95 * ((uint)bVar30 * auVar108._24_4_ | (uint)!bVar30 * local_e0._24_4_);
      local_4e0._28_4_ =
           (uint)(bVar90 >> 7) * auVar107._28_4_ |
           (uint)!(bool)(bVar90 >> 7) *
           ((uint)bVar31 * auVar108._28_4_ | (uint)!bVar31 * local_e0._28_4_);
      auVar107 = vrcp14ps_avx512vl(auVar113);
      auVar108 = vfnmadd213ps_avx512vl(auVar107,auVar113,auVar149);
      auVar101 = vfmadd132ps_fma(auVar108,auVar107,auVar107);
      auVar156 = ZEXT1664(auVar101);
      iVar1 = (uint)!(bool)(bVar88 & 1) * 0x3f800000;
      iVar2 = (uint)!(bool)((byte)(uVar99 >> 1) & 1) * 0x3f800000;
      iVar3 = (uint)!(bool)((byte)(uVar99 >> 2) & 1) * 0x3f800000;
      iVar4 = (uint)!(bool)((byte)(uVar99 >> 3) & 1) * 0x3f800000;
      iVar5 = (uint)!(bool)((byte)(uVar99 >> 4) & 1) * 0x3f800000;
      iVar6 = (uint)!(bool)((byte)(uVar99 >> 5) & 1) * 0x3f800000;
      iVar7 = (uint)!(bool)((byte)(uVar99 >> 6) & 1) * 0x3f800000;
      iVar8 = (uint)!SUB81(uVar99 >> 7,0) * 0x3f800000;
      auVar174 = ZEXT3264(CONCAT428(iVar8,CONCAT424(iVar7,CONCAT420(iVar6,CONCAT416(iVar5,CONCAT412(
                                                  iVar4,CONCAT48(iVar3,CONCAT44(iVar2,iVar1))))))));
      auVar107 = vmulps_avx512vl(auVar134,ZEXT1632(auVar101));
      local_580._0_4_ = (uint)(bVar90 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar90 & 1) * iVar1;
      bVar95 = (bool)(bVar90 >> 1 & 1);
      local_580._4_4_ = (uint)bVar95 * auVar107._4_4_ | (uint)!bVar95 * iVar2;
      bVar95 = (bool)(bVar90 >> 2 & 1);
      local_580._8_4_ = (uint)bVar95 * auVar107._8_4_ | (uint)!bVar95 * iVar3;
      bVar95 = (bool)(bVar90 >> 3 & 1);
      local_580._12_4_ = (uint)bVar95 * auVar107._12_4_ | (uint)!bVar95 * iVar4;
      bVar95 = (bool)(bVar90 >> 4 & 1);
      local_580._16_4_ = (uint)bVar95 * auVar107._16_4_ | (uint)!bVar95 * iVar5;
      bVar95 = (bool)(bVar90 >> 5 & 1);
      local_580._20_4_ = (uint)bVar95 * auVar107._20_4_ | (uint)!bVar95 * iVar6;
      bVar95 = (bool)(bVar90 >> 6 & 1);
      local_580._24_4_ = (uint)bVar95 * auVar107._24_4_ | (uint)!bVar95 * iVar7;
      local_580._28_4_ = (uint)(bVar90 >> 7) * auVar107._28_4_ | (uint)!(bool)(bVar90 >> 7) * iVar8;
      local_540._0_4_ = auVar142._0_4_ + auVar133._0_4_;
      local_540._4_4_ = auVar142._4_4_ + auVar133._4_4_;
      local_540._8_4_ = auVar142._8_4_ + auVar133._8_4_;
      local_540._12_4_ = auVar142._12_4_ + auVar133._12_4_;
      local_540._16_4_ = auVar142._16_4_ + auVar133._16_4_;
      local_540._20_4_ = auVar142._20_4_ + auVar133._20_4_;
      local_540._24_4_ = auVar142._24_4_ + auVar133._24_4_;
      local_540._28_4_ = auVar133._28_4_ + 0.0;
      local_560 = ZEXT1232(ZEXT812(0)) << 0x20;
      uVar96 = (ulong)(bVar98 & ((byte)uVar100 | bVar97));
      auVar107 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
      auVar151 = ZEXT3264(auVar107);
      auVar107 = vpcmpeqd_avx2(local_520,local_520);
      auVar157 = ZEXT3264(auVar107);
      do {
        bVar98 = (byte)uVar100;
        local_650.valid = (int *)local_620;
        auVar105 = auVar174._0_32_;
        auVar108 = auVar156._0_32_;
        auVar116 = auVar180._0_32_;
        auVar115 = auVar179._0_32_;
        auVar113 = auVar168._0_32_;
        auVar114 = auVar178._0_32_;
        auVar107 = auVar153._0_32_;
        auVar103 = auVar172._0_32_;
        auVar104 = auVar173._0_32_;
        auVar112 = auVar161._0_32_;
        auVar109 = auVar159._0_32_;
        auVar119 = auVar182._0_32_;
        auVar118 = auVar181._0_32_;
        auVar111 = auVar177._0_32_;
        auVar110 = auVar176._0_32_;
        auVar106 = auVar175._0_32_;
        auVar123 = auVar169._0_32_;
        auVar124 = auVar171._0_32_;
        auVar128 = auVar170._0_32_;
        auVar117 = auVar167._0_32_;
        auVar135 = auVar165._0_32_;
        uVar87 = 0;
        for (uVar99 = uVar96; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x8000000000000000) {
          uVar87 = uVar87 + 1;
        }
        pGVar22 = (pSVar21->geometries).items[*(uint *)(local_220 + uVar87 * 4)].ptr;
        local_650.ray = (RTCRayN *)ray;
        if ((pGVar22->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar95 = true, pGVar22->occlusionFilterN == (RTCFilterFunctionN)0x0))
          goto LAB_0198521d;
          uVar99 = (ulong)(uint)((int)uVar87 * 4);
          uVar11 = *(undefined4 *)(local_580 + uVar99);
          local_1a0._4_4_ = uVar11;
          local_1a0._0_4_ = uVar11;
          local_1a0._8_4_ = uVar11;
          local_1a0._12_4_ = uVar11;
          local_1a0._16_4_ = uVar11;
          local_1a0._20_4_ = uVar11;
          local_1a0._24_4_ = uVar11;
          local_1a0._28_4_ = uVar11;
          uVar11 = *(undefined4 *)(local_560 + uVar99);
          local_180._4_4_ = uVar11;
          local_180._0_4_ = uVar11;
          local_180._8_4_ = uVar11;
          local_180._12_4_ = uVar11;
          local_180._16_4_ = uVar11;
          local_180._20_4_ = uVar11;
          local_180._24_4_ = uVar11;
          local_180._28_4_ = uVar11;
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_540 + uVar99);
          local_650.context = context->user;
          local_140 = vpbroadcastd_avx512vl();
          uVar11 = *(undefined4 *)((long)&(line->primIDs).field_0 + uVar99);
          local_160._4_4_ = uVar11;
          local_160._0_4_ = uVar11;
          local_160._8_4_ = uVar11;
          local_160._12_4_ = uVar11;
          local_160._16_4_ = uVar11;
          local_160._20_4_ = uVar11;
          local_160._24_4_ = uVar11;
          local_160._28_4_ = uVar11;
          uVar11 = *(undefined4 *)(local_520 + uVar99);
          uVar12 = *(undefined4 *)(local_500 + uVar99);
          local_1e0._4_4_ = uVar12;
          local_1e0._0_4_ = uVar12;
          local_1e0._8_4_ = uVar12;
          local_1e0._12_4_ = uVar12;
          local_1e0._16_4_ = uVar12;
          local_1e0._20_4_ = uVar12;
          local_1e0._24_4_ = uVar12;
          local_1e0._28_4_ = uVar12;
          uVar12 = *(undefined4 *)(local_4e0 + uVar99);
          local_1c0._4_4_ = uVar12;
          local_1c0._0_4_ = uVar12;
          local_1c0._8_4_ = uVar12;
          local_1c0._12_4_ = uVar12;
          local_1c0._16_4_ = uVar12;
          local_1c0._20_4_ = uVar12;
          local_1c0._24_4_ = uVar12;
          local_1c0._28_4_ = uVar12;
          local_200[0] = (RTCHitN)(char)uVar11;
          local_200[1] = (RTCHitN)(char)((uint)uVar11 >> 8);
          local_200[2] = (RTCHitN)(char)((uint)uVar11 >> 0x10);
          local_200[3] = (RTCHitN)(char)((uint)uVar11 >> 0x18);
          local_200[4] = (RTCHitN)(char)uVar11;
          local_200[5] = (RTCHitN)(char)((uint)uVar11 >> 8);
          local_200[6] = (RTCHitN)(char)((uint)uVar11 >> 0x10);
          local_200[7] = (RTCHitN)(char)((uint)uVar11 >> 0x18);
          local_200[8] = (RTCHitN)(char)uVar11;
          local_200[9] = (RTCHitN)(char)((uint)uVar11 >> 8);
          local_200[10] = (RTCHitN)(char)((uint)uVar11 >> 0x10);
          local_200[0xb] = (RTCHitN)(char)((uint)uVar11 >> 0x18);
          local_200[0xc] = (RTCHitN)(char)uVar11;
          local_200[0xd] = (RTCHitN)(char)((uint)uVar11 >> 8);
          local_200[0xe] = (RTCHitN)(char)((uint)uVar11 >> 0x10);
          local_200[0xf] = (RTCHitN)(char)((uint)uVar11 >> 0x18);
          local_200[0x10] = (RTCHitN)(char)uVar11;
          local_200[0x11] = (RTCHitN)(char)((uint)uVar11 >> 8);
          local_200[0x12] = (RTCHitN)(char)((uint)uVar11 >> 0x10);
          local_200[0x13] = (RTCHitN)(char)((uint)uVar11 >> 0x18);
          local_200[0x14] = (RTCHitN)(char)uVar11;
          local_200[0x15] = (RTCHitN)(char)((uint)uVar11 >> 8);
          local_200[0x16] = (RTCHitN)(char)((uint)uVar11 >> 0x10);
          local_200[0x17] = (RTCHitN)(char)((uint)uVar11 >> 0x18);
          local_200[0x18] = (RTCHitN)(char)uVar11;
          local_200[0x19] = (RTCHitN)(char)((uint)uVar11 >> 8);
          local_200[0x1a] = (RTCHitN)(char)((uint)uVar11 >> 0x10);
          local_200[0x1b] = (RTCHitN)(char)((uint)uVar11 >> 0x18);
          local_200[0x1c] = (RTCHitN)(char)uVar11;
          local_200[0x1d] = (RTCHitN)(char)((uint)uVar11 >> 8);
          local_200[0x1e] = (RTCHitN)(char)((uint)uVar11 >> 0x10);
          local_200[0x1f] = (RTCHitN)(char)((uint)uVar11 >> 0x18);
          uStack_11c = (local_650.context)->instID[0];
          local_120 = uStack_11c;
          uStack_118 = uStack_11c;
          uStack_114 = uStack_11c;
          uStack_110 = uStack_11c;
          uStack_10c = uStack_11c;
          uStack_108 = uStack_11c;
          uStack_104 = uStack_11c;
          uStack_fc = (local_650.context)->instPrimID[0];
          local_100 = uStack_fc;
          uStack_f8 = uStack_fc;
          uStack_f4 = uStack_fc;
          uStack_f0 = uStack_fc;
          uStack_ec = uStack_fc;
          uStack_e8 = uStack_fc;
          uStack_e4 = uStack_fc;
          local_620 = auVar151._0_32_;
          local_650.geometryUserPtr = pGVar22->userPtr;
          local_650.hit = local_200;
          local_650.N = 8;
          local_240 = auVar106;
          local_260 = auVar110;
          local_280 = auVar111;
          local_2a0 = auVar114;
          local_2c0 = auVar115;
          local_2e0 = auVar116;
          local_300 = auVar118;
          local_320 = auVar119;
          local_340 = auVar105;
          local_360 = auVar103;
          local_380 = auVar123;
          local_3a0 = auVar135;
          local_3c0 = auVar128;
          local_3e0 = auVar117;
          local_400 = auVar124;
          local_420 = auVar109;
          local_440 = auVar112;
          local_460 = auVar104;
          local_480 = auVar107;
          local_4a0 = auVar108;
          local_4c0 = auVar113;
          uVar99 = uVar100;
          local_600 = local_620;
          if (pGVar22->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar107 = ZEXT1632(auVar157._0_16_);
            (*pGVar22->occlusionFilterN)(&local_650);
            auVar107 = vpcmpeqd_avx2(auVar107,auVar107);
            auVar157 = ZEXT3264(auVar107);
            auVar168 = ZEXT3264(local_4c0);
            auVar156 = ZEXT3264(local_4a0);
            auVar153 = ZEXT3264(local_480);
            auVar173 = ZEXT3264(local_460);
            auVar161 = ZEXT3264(local_440);
            auVar159 = ZEXT3264(local_420);
            uVar99 = uVar100 & 0xffff;
            auVar171 = ZEXT3264(local_400);
            auVar167 = ZEXT3264(local_3e0);
            auVar170 = ZEXT3264(local_3c0);
            auVar165 = ZEXT3264(local_3a0);
            auVar169 = ZEXT3264(local_380);
            auVar151 = ZEXT3264(local_600);
            auVar172 = ZEXT3264(local_360);
            auVar174 = ZEXT3264(local_340);
            auVar182 = ZEXT3264(local_320);
            auVar181 = ZEXT3264(local_300);
            auVar180 = ZEXT3264(local_2e0);
            auVar179 = ZEXT3264(local_2c0);
            auVar178 = ZEXT3264(local_2a0);
            auVar177 = ZEXT3264(local_280);
            auVar176 = ZEXT3264(local_260);
            auVar175 = ZEXT3264(local_240);
          }
          if (local_620 != (undefined1  [32])0x0) {
            p_Var24 = context->args->filter;
            if ((p_Var24 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar22->field_8).field_0x2 & 0x40) != 0)))) {
              auVar107 = ZEXT1632(auVar157._0_16_);
              (*p_Var24)(&local_650);
              auVar107 = vpcmpeqd_avx2(auVar107,auVar107);
              auVar157 = ZEXT3264(auVar107);
              auVar168 = ZEXT3264(local_4c0);
              auVar156 = ZEXT3264(local_4a0);
              auVar153 = ZEXT3264(local_480);
              auVar173 = ZEXT3264(local_460);
              auVar161 = ZEXT3264(local_440);
              auVar159 = ZEXT3264(local_420);
              uVar99 = uVar100 & 0xffff;
              auVar171 = ZEXT3264(local_400);
              auVar167 = ZEXT3264(local_3e0);
              auVar170 = ZEXT3264(local_3c0);
              auVar165 = ZEXT3264(local_3a0);
              auVar169 = ZEXT3264(local_380);
              auVar151 = ZEXT3264(local_600);
              auVar172 = ZEXT3264(local_360);
              auVar174 = ZEXT3264(local_340);
              auVar182 = ZEXT3264(local_320);
              auVar181 = ZEXT3264(local_300);
              auVar180 = ZEXT3264(local_2e0);
              auVar179 = ZEXT3264(local_2c0);
              auVar178 = ZEXT3264(local_2a0);
              auVar177 = ZEXT3264(local_280);
              auVar176 = ZEXT3264(local_260);
              auVar175 = ZEXT3264(local_240);
            }
            bVar98 = (byte)uVar99;
            auVar105 = auVar174._0_32_;
            auVar108 = auVar156._0_32_;
            auVar116 = auVar180._0_32_;
            auVar115 = auVar179._0_32_;
            auVar113 = auVar168._0_32_;
            auVar114 = auVar178._0_32_;
            auVar107 = auVar153._0_32_;
            auVar103 = auVar172._0_32_;
            auVar104 = auVar173._0_32_;
            auVar112 = auVar161._0_32_;
            auVar109 = auVar159._0_32_;
            auVar119 = auVar182._0_32_;
            auVar118 = auVar181._0_32_;
            auVar111 = auVar177._0_32_;
            auVar110 = auVar176._0_32_;
            auVar106 = auVar175._0_32_;
            auVar123 = auVar169._0_32_;
            auVar124 = auVar171._0_32_;
            auVar128 = auVar170._0_32_;
            auVar117 = auVar167._0_32_;
            auVar135 = auVar165._0_32_;
            uVar86 = vptestmd_avx512vl(local_620,local_620);
            auVar120 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar95 = (bool)((byte)uVar86 & 1);
            auVar136._0_4_ =
                 (uint)bVar95 * auVar120._0_4_ | (uint)!bVar95 * *(int *)(local_650.ray + 0x100);
            bVar95 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar136._4_4_ =
                 (uint)bVar95 * auVar120._4_4_ | (uint)!bVar95 * *(int *)(local_650.ray + 0x104);
            bVar95 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar136._8_4_ =
                 (uint)bVar95 * auVar120._8_4_ | (uint)!bVar95 * *(int *)(local_650.ray + 0x108);
            bVar95 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar136._12_4_ =
                 (uint)bVar95 * auVar120._12_4_ | (uint)!bVar95 * *(int *)(local_650.ray + 0x10c);
            bVar95 = (bool)((byte)(uVar86 >> 4) & 1);
            auVar136._16_4_ =
                 (uint)bVar95 * auVar120._16_4_ | (uint)!bVar95 * *(int *)(local_650.ray + 0x110);
            bVar95 = (bool)((byte)(uVar86 >> 5) & 1);
            auVar136._20_4_ =
                 (uint)bVar95 * auVar120._20_4_ | (uint)!bVar95 * *(int *)(local_650.ray + 0x114);
            bVar95 = (bool)((byte)(uVar86 >> 6) & 1);
            auVar136._24_4_ =
                 (uint)bVar95 * auVar120._24_4_ | (uint)!bVar95 * *(int *)(local_650.ray + 0x118);
            bVar95 = SUB81(uVar86 >> 7,0);
            auVar136._28_4_ =
                 (uint)bVar95 * auVar120._28_4_ | (uint)!bVar95 * *(int *)(local_650.ray + 0x11c);
            *(undefined1 (*) [32])(local_650.ray + 0x100) = auVar136;
            if (local_620 != (undefined1  [32])0x0) {
              local_5e0 = ZEXT432(*(uint *)(ray + k * 4 + 0x100));
              bVar95 = true;
              goto LAB_0198521d;
            }
          }
          *(int *)(ray + k * 4 + 0x100) = local_5e0._0_4_;
          uVar100 = uVar99;
        }
        bVar98 = (byte)uVar100;
        auVar105 = auVar174._0_32_;
        auVar108 = auVar156._0_32_;
        auVar116 = auVar180._0_32_;
        auVar115 = auVar179._0_32_;
        auVar113 = auVar168._0_32_;
        auVar114 = auVar178._0_32_;
        auVar107 = auVar153._0_32_;
        auVar103 = auVar172._0_32_;
        auVar104 = auVar173._0_32_;
        auVar112 = auVar161._0_32_;
        auVar109 = auVar159._0_32_;
        auVar119 = auVar182._0_32_;
        auVar118 = auVar181._0_32_;
        auVar111 = auVar177._0_32_;
        auVar110 = auVar176._0_32_;
        auVar106 = auVar175._0_32_;
        auVar123 = auVar169._0_32_;
        auVar124 = auVar171._0_32_;
        auVar128 = auVar170._0_32_;
        auVar117 = auVar167._0_32_;
        auVar135 = auVar165._0_32_;
        uVar96 = uVar96 ^ 1L << (uVar87 & 0x3f);
      } while (uVar96 != 0);
      bVar95 = false;
LAB_0198521d:
      auVar139._4_4_ = local_5e0._0_4_;
      auVar139._0_4_ = local_5e0._0_4_;
      auVar139._8_4_ = local_5e0._0_4_;
      auVar139._12_4_ = local_5e0._0_4_;
      auVar139._16_4_ = local_5e0._0_4_;
      auVar139._20_4_ = local_5e0._0_4_;
      auVar139._24_4_ = local_5e0._0_4_;
      auVar139._28_4_ = local_5e0._0_4_;
      uVar82 = vcmpps_avx512vl(auVar135,auVar139,2);
      bVar98 = bVar98 & (byte)uVar82;
      if ((bVar98 & bVar89) == 0) {
        return bVar95;
      }
      uVar82 = vcmpps_avx512vl(auVar117,auVar128,0);
      uVar83 = vcmpps_avx512vl(auVar117,auVar124,0);
      bVar97 = (byte)uVar82 | (byte)uVar83;
      uVar96 = vcmpps_avx512vl(auVar117,auVar123,0);
      auVar123 = vmulps_avx512vl(auVar106,auVar117);
      auVar128 = vmulps_avx512vl(auVar110,auVar117);
      auVar117 = vmulps_avx512vl(auVar111,auVar117);
      auVar140._0_4_ = auVar123._0_4_ + (float)local_5a0._0_4_;
      auVar140._4_4_ = auVar123._4_4_ + (float)local_5a0._4_4_;
      auVar140._8_4_ = auVar123._8_4_ + fStack_598;
      auVar140._12_4_ = auVar123._12_4_ + fStack_594;
      auVar140._16_4_ = auVar123._16_4_ + fStack_590;
      auVar140._20_4_ = auVar123._20_4_ + fStack_58c;
      auVar140._24_4_ = auVar123._24_4_ + fStack_588;
      auVar140._28_4_ = auVar123._28_4_ + fStack_584;
      auVar123 = vaddps_avx512vl(auVar118,auVar128);
      auVar144._0_4_ = auVar117._0_4_ + (float)local_5c0._0_4_;
      auVar144._4_4_ = auVar117._4_4_ + (float)local_5c0._4_4_;
      auVar144._8_4_ = auVar117._8_4_ + fStack_5b8;
      auVar144._12_4_ = auVar117._12_4_ + fStack_5b4;
      auVar144._16_4_ = auVar117._16_4_ + fStack_5b0;
      auVar144._20_4_ = auVar117._20_4_ + fStack_5ac;
      auVar144._24_4_ = auVar117._24_4_ + fStack_5a8;
      auVar144._28_4_ = auVar117._28_4_ + fStack_5a4;
      auVar117 = vmulps_avx512vl(auVar119,auVar140);
      auVar123 = vmulps_avx512vl(auVar119,auVar123);
      auVar128 = vmulps_avx512vl(auVar119,auVar144);
      auVar141._0_4_ = auVar109._0_4_ + auVar117._0_4_;
      auVar141._4_4_ = auVar109._4_4_ + auVar117._4_4_;
      auVar141._8_4_ = auVar109._8_4_ + auVar117._8_4_;
      auVar141._12_4_ = auVar109._12_4_ + auVar117._12_4_;
      auVar141._16_4_ = auVar109._16_4_ + auVar117._16_4_;
      auVar141._20_4_ = auVar109._20_4_ + auVar117._20_4_;
      auVar141._24_4_ = auVar109._24_4_ + auVar117._24_4_;
      auVar141._28_4_ = auVar109._28_4_ + auVar117._28_4_;
      auVar143._0_4_ = auVar112._0_4_ + auVar123._0_4_;
      auVar143._4_4_ = auVar112._4_4_ + auVar123._4_4_;
      auVar143._8_4_ = auVar112._8_4_ + auVar123._8_4_;
      auVar143._12_4_ = auVar112._12_4_ + auVar123._12_4_;
      auVar143._16_4_ = auVar112._16_4_ + auVar123._16_4_;
      auVar143._20_4_ = auVar112._20_4_ + auVar123._20_4_;
      auVar143._24_4_ = auVar112._24_4_ + auVar123._24_4_;
      auVar143._28_4_ = auVar112._28_4_ + auVar123._28_4_;
      auVar109 = vaddps_avx512vl(auVar104,auVar128);
      auVar112 = vmulps_avx512vl(auVar103,local_80);
      auVar117 = vmulps_avx512vl(auVar103,local_a0);
      auVar123 = vmulps_avx512vl(auVar107,auVar103);
      bVar88 = (byte)uVar96;
      bVar25 = (bool)((byte)(uVar96 >> 1) & 1);
      bVar32 = (bool)((byte)(uVar96 >> 2) & 1);
      bVar65 = (bool)((byte)(uVar96 >> 3) & 1);
      bVar40 = (bool)((byte)(uVar96 >> 4) & 1);
      bVar49 = (bool)((byte)(uVar96 >> 5) & 1);
      bVar58 = (bool)((byte)(uVar96 >> 6) & 1);
      bVar67 = SUB81(uVar96 >> 7,0);
      bVar26 = (bool)((byte)(uVar96 >> 1) & 1);
      bVar38 = (bool)((byte)(uVar96 >> 2) & 1);
      bVar66 = (bool)((byte)(uVar96 >> 3) & 1);
      bVar41 = (bool)((byte)(uVar96 >> 4) & 1);
      bVar50 = (bool)((byte)(uVar96 >> 5) & 1);
      bVar59 = (bool)((byte)(uVar96 >> 6) & 1);
      bVar68 = SUB81(uVar96 >> 7,0);
      bVar27 = (bool)((byte)(uVar96 >> 1) & 1);
      bVar39 = (bool)((byte)(uVar96 >> 2) & 1);
      bVar33 = (bool)((byte)(uVar96 >> 3) & 1);
      bVar42 = (bool)((byte)(uVar96 >> 4) & 1);
      bVar51 = (bool)((byte)(uVar96 >> 5) & 1);
      bVar60 = (bool)((byte)(uVar96 >> 6) & 1);
      bVar69 = SUB81(uVar96 >> 7,0);
      auVar112 = vsubps_avx512vl(auVar141,auVar112);
      bVar28 = (bool)(bVar97 >> 1 & 1);
      bVar47 = (bool)(bVar97 >> 2 & 1);
      bVar34 = (bool)(bVar97 >> 3 & 1);
      bVar43 = (bool)(bVar97 >> 4 & 1);
      bVar52 = (bool)(bVar97 >> 5 & 1);
      bVar61 = (bool)(bVar97 >> 6 & 1);
      auVar117 = vsubps_avx512vl(auVar143,auVar117);
      bVar29 = (bool)(bVar97 >> 1 & 1);
      bVar48 = (bool)(bVar97 >> 2 & 1);
      bVar35 = (bool)(bVar97 >> 3 & 1);
      bVar44 = (bool)(bVar97 >> 4 & 1);
      bVar53 = (bool)(bVar97 >> 5 & 1);
      bVar62 = (bool)(bVar97 >> 6 & 1);
      auVar109 = vsubps_avx512vl(auVar109,auVar123);
      bVar30 = (bool)(bVar97 >> 1 & 1);
      bVar56 = (bool)(bVar97 >> 2 & 1);
      bVar36 = (bool)(bVar97 >> 3 & 1);
      bVar45 = (bool)(bVar97 >> 4 & 1);
      bVar54 = (bool)(bVar97 >> 5 & 1);
      bVar63 = (bool)(bVar97 >> 6 & 1);
      auVar108 = vmulps_avx512vl(auVar103,auVar108);
      bVar31 = (bool)(bVar97 >> 1 & 1);
      bVar57 = (bool)(bVar97 >> 2 & 1);
      bVar37 = (bool)(bVar97 >> 3 & 1);
      bVar46 = (bool)(bVar97 >> 4 & 1);
      bVar55 = (bool)(bVar97 >> 5 & 1);
      bVar64 = (bool)(bVar97 >> 6 & 1);
      local_580._4_4_ = (uint)bVar31 * auVar108._4_4_ | (uint)!bVar31 * auVar105._4_4_;
      local_580._0_4_ =
           (uint)(bVar97 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar97 & 1) * auVar105._0_4_;
      local_580._8_4_ = (uint)bVar57 * auVar108._8_4_ | (uint)!bVar57 * auVar105._8_4_;
      local_580._12_4_ = (uint)bVar37 * auVar108._12_4_ | (uint)!bVar37 * auVar105._12_4_;
      local_580._16_4_ = (uint)bVar46 * auVar108._16_4_ | (uint)!bVar46 * auVar105._16_4_;
      local_580._20_4_ = (uint)bVar55 * auVar108._20_4_ | (uint)!bVar55 * auVar105._20_4_;
      local_580._24_4_ = (uint)bVar64 * auVar108._24_4_ | (uint)!bVar64 * auVar105._24_4_;
      local_580._28_4_ =
           (uint)(bVar97 >> 7) * auVar108._28_4_ | (uint)!(bool)(bVar97 >> 7) * auVar105._28_4_;
      local_560 = ZEXT432(0) << 0x20;
      local_540 = auVar135;
      local_520._4_4_ =
           (uint)bVar28 * auVar112._4_4_ |
           (uint)!bVar28 * ((uint)bVar25 * local_c0._4_4_ | (uint)!bVar25 * auVar114._4_4_);
      local_520._0_4_ =
           (uint)(bVar97 & 1) * auVar112._0_4_ |
           (uint)!(bool)(bVar97 & 1) *
           ((uint)(bVar88 & 1) * local_c0._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar114._0_4_);
      local_520._8_4_ =
           (uint)bVar47 * auVar112._8_4_ |
           (uint)!bVar47 * ((uint)bVar32 * local_c0._8_4_ | (uint)!bVar32 * auVar114._8_4_);
      local_520._12_4_ =
           (uint)bVar34 * auVar112._12_4_ |
           (uint)!bVar34 * ((uint)bVar65 * local_c0._12_4_ | (uint)!bVar65 * auVar114._12_4_);
      local_520._16_4_ =
           (uint)bVar43 * auVar112._16_4_ |
           (uint)!bVar43 * ((uint)bVar40 * local_c0._16_4_ | (uint)!bVar40 * auVar114._16_4_);
      local_520._20_4_ =
           (uint)bVar52 * auVar112._20_4_ |
           (uint)!bVar52 * ((uint)bVar49 * local_c0._20_4_ | (uint)!bVar49 * auVar114._20_4_);
      local_520._24_4_ =
           (uint)bVar61 * auVar112._24_4_ |
           (uint)!bVar61 * ((uint)bVar58 * local_c0._24_4_ | (uint)!bVar58 * auVar114._24_4_);
      local_520._28_4_ =
           (uint)(bVar97 >> 7) * auVar112._28_4_ |
           (uint)!(bool)(bVar97 >> 7) *
           ((uint)bVar67 * local_c0._28_4_ | (uint)!bVar67 * auVar114._28_4_);
      local_500._4_4_ =
           (uint)bVar29 * auVar117._4_4_ |
           (uint)!bVar29 * ((uint)bVar26 * auVar113._4_4_ | (uint)!bVar26 * auVar115._4_4_);
      local_500._0_4_ =
           (uint)(bVar97 & 1) * auVar117._0_4_ |
           (uint)!(bool)(bVar97 & 1) *
           ((uint)(bVar88 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar115._0_4_);
      local_500._8_4_ =
           (uint)bVar48 * auVar117._8_4_ |
           (uint)!bVar48 * ((uint)bVar38 * auVar113._8_4_ | (uint)!bVar38 * auVar115._8_4_);
      local_500._12_4_ =
           (uint)bVar35 * auVar117._12_4_ |
           (uint)!bVar35 * ((uint)bVar66 * auVar113._12_4_ | (uint)!bVar66 * auVar115._12_4_);
      local_500._16_4_ =
           (uint)bVar44 * auVar117._16_4_ |
           (uint)!bVar44 * ((uint)bVar41 * auVar113._16_4_ | (uint)!bVar41 * auVar115._16_4_);
      local_500._20_4_ =
           (uint)bVar53 * auVar117._20_4_ |
           (uint)!bVar53 * ((uint)bVar50 * auVar113._20_4_ | (uint)!bVar50 * auVar115._20_4_);
      local_500._24_4_ =
           (uint)bVar62 * auVar117._24_4_ |
           (uint)!bVar62 * ((uint)bVar59 * auVar113._24_4_ | (uint)!bVar59 * auVar115._24_4_);
      local_500._28_4_ =
           (uint)(bVar97 >> 7) * auVar117._28_4_ |
           (uint)!(bool)(bVar97 >> 7) *
           ((uint)bVar68 * auVar113._28_4_ | (uint)!bVar68 * auVar115._28_4_);
      local_4e0._4_4_ =
           (uint)bVar30 * auVar109._4_4_ |
           (uint)!bVar30 * ((uint)bVar27 * local_e0._4_4_ | (uint)!bVar27 * auVar116._4_4_);
      local_4e0._0_4_ =
           (uint)(bVar97 & 1) * auVar109._0_4_ |
           (uint)!(bool)(bVar97 & 1) *
           ((uint)(bVar88 & 1) * local_e0._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar116._0_4_);
      local_4e0._8_4_ =
           (uint)bVar56 * auVar109._8_4_ |
           (uint)!bVar56 * ((uint)bVar39 * local_e0._8_4_ | (uint)!bVar39 * auVar116._8_4_);
      local_4e0._12_4_ =
           (uint)bVar36 * auVar109._12_4_ |
           (uint)!bVar36 * ((uint)bVar33 * local_e0._12_4_ | (uint)!bVar33 * auVar116._12_4_);
      local_4e0._16_4_ =
           (uint)bVar45 * auVar109._16_4_ |
           (uint)!bVar45 * ((uint)bVar42 * local_e0._16_4_ | (uint)!bVar42 * auVar116._16_4_);
      local_4e0._20_4_ =
           (uint)bVar54 * auVar109._20_4_ |
           (uint)!bVar54 * ((uint)bVar51 * local_e0._20_4_ | (uint)!bVar51 * auVar116._20_4_);
      local_4e0._24_4_ =
           (uint)bVar63 * auVar109._24_4_ |
           (uint)!bVar63 * ((uint)bVar60 * local_e0._24_4_ | (uint)!bVar60 * auVar116._24_4_);
      local_4e0._28_4_ =
           (uint)(bVar97 >> 7) * auVar109._28_4_ |
           (uint)!(bool)(bVar97 >> 7) *
           ((uint)bVar69 * local_e0._28_4_ | (uint)!bVar69 * auVar116._28_4_);
      pSVar21 = context->scene;
      uVar96 = (ulong)(bVar98 & bVar89);
      auVar107 = vpcmpeqd_avx2(auVar107,auVar107);
      auVar175 = ZEXT3264(auVar107);
      do {
        local_650.valid = (int *)local_620;
        uVar87 = 0;
        for (uVar99 = uVar96; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x8000000000000000) {
          uVar87 = uVar87 + 1;
        }
        pGVar22 = (pSVar21->geometries).items[*(uint *)(local_220 + uVar87 * 4)].ptr;
        if ((pGVar22->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar98 = 1, pGVar22->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_01985571;
          uVar99 = (ulong)(uint)((int)uVar87 * 4);
          uVar11 = *(undefined4 *)(local_580 + uVar99);
          local_1a0._4_4_ = uVar11;
          local_1a0._0_4_ = uVar11;
          local_1a0._8_4_ = uVar11;
          local_1a0._12_4_ = uVar11;
          local_1a0._16_4_ = uVar11;
          local_1a0._20_4_ = uVar11;
          local_1a0._24_4_ = uVar11;
          local_1a0._28_4_ = uVar11;
          uVar11 = *(undefined4 *)(local_560 + uVar99);
          local_180._4_4_ = uVar11;
          local_180._0_4_ = uVar11;
          local_180._8_4_ = uVar11;
          local_180._12_4_ = uVar11;
          local_180._16_4_ = uVar11;
          local_180._20_4_ = uVar11;
          local_180._24_4_ = uVar11;
          local_180._28_4_ = uVar11;
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_540 + uVar99);
          local_650.context = context->user;
          local_140 = vpbroadcastd_avx512vl();
          uVar11 = *(undefined4 *)((long)&(line->primIDs).field_0 + uVar99);
          local_160._4_4_ = uVar11;
          local_160._0_4_ = uVar11;
          local_160._8_4_ = uVar11;
          local_160._12_4_ = uVar11;
          local_160._16_4_ = uVar11;
          local_160._20_4_ = uVar11;
          local_160._24_4_ = uVar11;
          local_160._28_4_ = uVar11;
          uVar11 = *(undefined4 *)(local_520 + uVar99);
          uVar12 = *(undefined4 *)(local_500 + uVar99);
          local_1e0._4_4_ = uVar12;
          local_1e0._0_4_ = uVar12;
          local_1e0._8_4_ = uVar12;
          local_1e0._12_4_ = uVar12;
          local_1e0._16_4_ = uVar12;
          local_1e0._20_4_ = uVar12;
          local_1e0._24_4_ = uVar12;
          local_1e0._28_4_ = uVar12;
          uVar12 = *(undefined4 *)(local_4e0 + uVar99);
          local_1c0._4_4_ = uVar12;
          local_1c0._0_4_ = uVar12;
          local_1c0._8_4_ = uVar12;
          local_1c0._12_4_ = uVar12;
          local_1c0._16_4_ = uVar12;
          local_1c0._20_4_ = uVar12;
          local_1c0._24_4_ = uVar12;
          local_1c0._28_4_ = uVar12;
          local_200[0] = (RTCHitN)(char)uVar11;
          local_200[1] = (RTCHitN)(char)((uint)uVar11 >> 8);
          local_200[2] = (RTCHitN)(char)((uint)uVar11 >> 0x10);
          local_200[3] = (RTCHitN)(char)((uint)uVar11 >> 0x18);
          local_200[4] = (RTCHitN)(char)uVar11;
          local_200[5] = (RTCHitN)(char)((uint)uVar11 >> 8);
          local_200[6] = (RTCHitN)(char)((uint)uVar11 >> 0x10);
          local_200[7] = (RTCHitN)(char)((uint)uVar11 >> 0x18);
          local_200[8] = (RTCHitN)(char)uVar11;
          local_200[9] = (RTCHitN)(char)((uint)uVar11 >> 8);
          local_200[10] = (RTCHitN)(char)((uint)uVar11 >> 0x10);
          local_200[0xb] = (RTCHitN)(char)((uint)uVar11 >> 0x18);
          local_200[0xc] = (RTCHitN)(char)uVar11;
          local_200[0xd] = (RTCHitN)(char)((uint)uVar11 >> 8);
          local_200[0xe] = (RTCHitN)(char)((uint)uVar11 >> 0x10);
          local_200[0xf] = (RTCHitN)(char)((uint)uVar11 >> 0x18);
          local_200[0x10] = (RTCHitN)(char)uVar11;
          local_200[0x11] = (RTCHitN)(char)((uint)uVar11 >> 8);
          local_200[0x12] = (RTCHitN)(char)((uint)uVar11 >> 0x10);
          local_200[0x13] = (RTCHitN)(char)((uint)uVar11 >> 0x18);
          local_200[0x14] = (RTCHitN)(char)uVar11;
          local_200[0x15] = (RTCHitN)(char)((uint)uVar11 >> 8);
          local_200[0x16] = (RTCHitN)(char)((uint)uVar11 >> 0x10);
          local_200[0x17] = (RTCHitN)(char)((uint)uVar11 >> 0x18);
          local_200[0x18] = (RTCHitN)(char)uVar11;
          local_200[0x19] = (RTCHitN)(char)((uint)uVar11 >> 8);
          local_200[0x1a] = (RTCHitN)(char)((uint)uVar11 >> 0x10);
          local_200[0x1b] = (RTCHitN)(char)((uint)uVar11 >> 0x18);
          local_200[0x1c] = (RTCHitN)(char)uVar11;
          local_200[0x1d] = (RTCHitN)(char)((uint)uVar11 >> 8);
          local_200[0x1e] = (RTCHitN)(char)((uint)uVar11 >> 0x10);
          local_200[0x1f] = (RTCHitN)(char)((uint)uVar11 >> 0x18);
          uStack_11c = (local_650.context)->instID[0];
          local_120 = uStack_11c;
          uStack_118 = uStack_11c;
          uStack_114 = uStack_11c;
          uStack_110 = uStack_11c;
          uStack_10c = uStack_11c;
          uStack_108 = uStack_11c;
          uStack_104 = uStack_11c;
          uStack_fc = (local_650.context)->instPrimID[0];
          local_100 = uStack_fc;
          uStack_f8 = uStack_fc;
          uStack_f4 = uStack_fc;
          uStack_f0 = uStack_fc;
          uStack_ec = uStack_fc;
          uStack_e8 = uStack_fc;
          uStack_e4 = uStack_fc;
          local_620 = auVar151._0_32_;
          local_650.geometryUserPtr = pGVar22->userPtr;
          local_650.hit = local_200;
          local_650.N = 8;
          local_650.ray = (RTCRayN *)ray;
          local_600 = local_620;
          if (pGVar22->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar107 = ZEXT1632(auVar175._0_16_);
            (*pGVar22->occlusionFilterN)(&local_650);
            auVar107 = vpcmpeqd_avx2(auVar107,auVar107);
            auVar175 = ZEXT3264(auVar107);
            auVar151 = ZEXT3264(local_600);
          }
          if (local_620 != (undefined1  [32])0x0) {
            p_Var24 = context->args->filter;
            if ((p_Var24 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar22->field_8).field_0x2 & 0x40) != 0)))) {
              auVar107 = ZEXT1632(auVar175._0_16_);
              (*p_Var24)(&local_650);
              auVar107 = vpcmpeqd_avx2(auVar107,auVar107);
              auVar175 = ZEXT3264(auVar107);
              auVar151 = ZEXT3264(local_600);
            }
            uVar99 = vptestmd_avx512vl(local_620,local_620);
            auVar107 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar25 = (bool)((byte)uVar99 & 1);
            auVar137._0_4_ =
                 (uint)bVar25 * auVar107._0_4_ | (uint)!bVar25 * *(int *)(local_650.ray + 0x100);
            bVar25 = (bool)((byte)(uVar99 >> 1) & 1);
            auVar137._4_4_ =
                 (uint)bVar25 * auVar107._4_4_ | (uint)!bVar25 * *(int *)(local_650.ray + 0x104);
            bVar25 = (bool)((byte)(uVar99 >> 2) & 1);
            auVar137._8_4_ =
                 (uint)bVar25 * auVar107._8_4_ | (uint)!bVar25 * *(int *)(local_650.ray + 0x108);
            bVar25 = (bool)((byte)(uVar99 >> 3) & 1);
            auVar137._12_4_ =
                 (uint)bVar25 * auVar107._12_4_ | (uint)!bVar25 * *(int *)(local_650.ray + 0x10c);
            bVar25 = (bool)((byte)(uVar99 >> 4) & 1);
            auVar137._16_4_ =
                 (uint)bVar25 * auVar107._16_4_ | (uint)!bVar25 * *(int *)(local_650.ray + 0x110);
            bVar25 = (bool)((byte)(uVar99 >> 5) & 1);
            auVar137._20_4_ =
                 (uint)bVar25 * auVar107._20_4_ | (uint)!bVar25 * *(int *)(local_650.ray + 0x114);
            bVar25 = (bool)((byte)(uVar99 >> 6) & 1);
            auVar137._24_4_ =
                 (uint)bVar25 * auVar107._24_4_ | (uint)!bVar25 * *(int *)(local_650.ray + 0x118);
            bVar25 = SUB81(uVar99 >> 7,0);
            auVar137._28_4_ =
                 (uint)bVar25 * auVar107._28_4_ | (uint)!bVar25 * *(int *)(local_650.ray + 0x11c);
            *(undefined1 (*) [32])(local_650.ray + 0x100) = auVar137;
            if (local_620 != (undefined1  [32])0x0) {
              bVar98 = 1;
              goto LAB_01985571;
            }
          }
          *(undefined4 *)(ray + k * 4 + 0x100) = local_5e0._0_4_;
        }
        uVar96 = uVar96 ^ 1L << (uVar87 & 0x3f);
        if (uVar96 == 0) {
          bVar98 = 0;
LAB_01985571:
          return (bool)(bVar95 | bVar98);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        return ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Occluded1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }